

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined6 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  int iVar62;
  undefined4 uVar63;
  ulong uVar64;
  long lVar65;
  undefined4 uVar70;
  undefined8 uVar66;
  RayK<4> *pRVar67;
  RTCFilterFunctionN p_Var68;
  undefined1 (*pauVar69) [16];
  RTCIntersectArguments *pRVar71;
  ulong uVar72;
  long lVar73;
  bool bVar74;
  ulong uVar75;
  int iVar76;
  ulong uVar77;
  bool bVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  short sVar83;
  undefined2 uVar124;
  float fVar84;
  float fVar85;
  float fVar125;
  float fVar127;
  __m128 a_1;
  float fVar126;
  float fVar128;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float pp;
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  float fVar160;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar161;
  float fVar175;
  float fVar176;
  vfloat4 v;
  float fVar177;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  float fVar203;
  float fVar204;
  vfloat4 v_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar214;
  float fVar215;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar237;
  float fVar238;
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar239;
  float fVar246;
  float fVar247;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar256;
  float fVar257;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar265;
  float fVar266;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar267;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar278;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar279;
  float fVar292;
  float fVar294;
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  float fVar293;
  float fVar295;
  float fVar296;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar297;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  float fVar313;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar318 [16];
  float fVar324;
  float fVar325;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar333;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar334 [16];
  float s;
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_678 [8];
  float fStack_670;
  float fStack_66c;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined8 local_5c8;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [16];
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [4];
  float fStack_564;
  undefined8 uStack_560;
  RTCRayQueryContext *local_558;
  RayK<4> *local_550;
  RTCHitN *local_548;
  uint local_540;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  undefined4 uStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 (*local_498) [16];
  ulong local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  Primitive *local_3e8;
  ulong local_3e0;
  uint local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 uVar123;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar245 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar288 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  
  PVar18 = prim[1];
  uVar64 = (ulong)(byte)PVar18;
  lVar22 = uVar64 * 0x25;
  pPVar9 = prim + lVar22 + 6;
  fVar176 = *(float *)(pPVar9 + 0xc);
  fVar178 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar176;
  fVar203 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar176;
  fVar204 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar176;
  fVar161 = *(float *)(ray + k * 4 + 0x40) * fVar176;
  fVar175 = *(float *)(ray + k * 4 + 0x50) * fVar176;
  fVar176 = *(float *)(ray + k * 4 + 0x60) * fVar176;
  uVar63 = *(undefined4 *)(prim + uVar64 * 4 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar77;
  auVar272._12_2_ = uVar124;
  auVar272._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar163._12_4_ = auVar272._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar77;
  auVar163._10_2_ = uVar124;
  auVar86._10_6_ = auVar163._10_6_;
  auVar86._8_2_ = uVar124;
  auVar86._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar41._4_8_ = auVar86._8_8_;
  auVar41._2_2_ = uVar124;
  auVar41._0_2_ = uVar124;
  fVar84 = (float)((int)sVar83 >> 8);
  fVar125 = (float)(auVar41._0_4_ >> 0x18);
  fVar127 = (float)(auVar86._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 5 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar77;
  auVar131._12_2_ = uVar124;
  auVar131._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar77;
  auVar130._10_2_ = uVar124;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar124;
  auVar129._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar42._4_8_ = auVar129._8_8_;
  auVar42._2_2_ = uVar124;
  auVar42._0_2_ = uVar124;
  fVar205 = (float)((int)sVar83 >> 8);
  fVar214 = (float)(auVar42._0_4_ >> 0x18);
  fVar215 = (float)(auVar129._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 6 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar77;
  auVar134._12_2_ = uVar124;
  auVar134._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar77;
  auVar133._10_2_ = uVar124;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar124;
  auVar132._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar43._4_8_ = auVar132._8_8_;
  auVar43._2_2_ = uVar124;
  auVar43._0_2_ = uVar124;
  fVar258 = (float)((int)sVar83 >> 8);
  fVar265 = (float)(auVar43._0_4_ >> 0x18);
  fVar266 = (float)(auVar132._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0xf + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar137._8_4_ = 0;
  auVar137._0_8_ = uVar77;
  auVar137._12_2_ = uVar124;
  auVar137._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar77;
  auVar136._10_2_ = uVar124;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._8_2_ = uVar124;
  auVar135._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar44._4_8_ = auVar135._8_8_;
  auVar44._2_2_ = uVar124;
  auVar44._0_2_ = uVar124;
  fVar85 = (float)((int)sVar83 >> 8);
  fVar126 = (float)(auVar44._0_4_ >> 0x18);
  fVar128 = (float)(auVar135._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar77;
  auVar219._12_2_ = uVar124;
  auVar219._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar77;
  auVar218._10_2_ = uVar124;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar124;
  auVar217._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar45._4_8_ = auVar217._8_8_;
  auVar45._2_2_ = uVar124;
  auVar45._0_2_ = uVar124;
  fVar248 = (float)((int)sVar83 >> 8);
  fVar256 = (float)(auVar45._0_4_ >> 0x18);
  fVar257 = (float)(auVar217._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar64 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar77;
  auVar222._12_2_ = uVar124;
  auVar222._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar77;
  auVar221._10_2_ = uVar124;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar124;
  auVar220._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar46._4_8_ = auVar220._8_8_;
  auVar46._2_2_ = uVar124;
  auVar46._0_2_ = uVar124;
  fVar267 = (float)((int)sVar83 >> 8);
  fVar276 = (float)(auVar46._0_4_ >> 0x18);
  fVar277 = (float)(auVar220._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1a + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar77;
  auVar225._12_2_ = uVar124;
  auVar225._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar77;
  auVar224._10_2_ = uVar124;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar124;
  auVar223._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar47._4_8_ = auVar223._8_8_;
  auVar47._2_2_ = uVar124;
  auVar47._0_2_ = uVar124;
  fVar325 = (float)((int)sVar83 >> 8);
  fVar331 = (float)(auVar47._0_4_ >> 0x18);
  fVar332 = (float)(auVar223._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1b + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar228._8_4_ = 0;
  auVar228._0_8_ = uVar77;
  auVar228._12_2_ = uVar124;
  auVar228._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar227._12_4_ = auVar228._12_4_;
  auVar227._8_2_ = 0;
  auVar227._0_8_ = uVar77;
  auVar227._10_2_ = uVar124;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226._8_2_ = uVar124;
  auVar226._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar48._4_8_ = auVar226._8_8_;
  auVar48._2_2_ = uVar124;
  auVar48._0_2_ = uVar124;
  fVar279 = (float)((int)sVar83 >> 8);
  fVar292 = (float)(auVar48._0_4_ >> 0x18);
  fVar294 = (float)(auVar226._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1c + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar123),uVar123);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar77;
  auVar231._12_2_ = uVar124;
  auVar231._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar77;
  auVar230._10_2_ = uVar124;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = uVar124;
  auVar229._0_8_ = uVar77;
  uVar124 = (undefined2)uVar40;
  auVar49._4_8_ = auVar229._8_8_;
  auVar49._2_2_ = uVar124;
  auVar49._0_2_ = uVar124;
  fVar239 = (float)((int)sVar83 >> 8);
  fVar246 = (float)(auVar49._0_4_ >> 0x18);
  fVar247 = (float)(auVar229._8_4_ >> 0x18);
  fVar312 = fVar161 * fVar84 + fVar175 * fVar205 + fVar176 * fVar258;
  fVar319 = fVar161 * fVar125 + fVar175 * fVar214 + fVar176 * fVar265;
  fVar321 = fVar161 * fVar127 + fVar175 * fVar215 + fVar176 * fVar266;
  fVar323 = fVar161 * (float)(auVar163._12_4_ >> 0x18) +
            fVar175 * (float)(auVar130._12_4_ >> 0x18) + fVar176 * (float)(auVar133._12_4_ >> 0x18);
  fVar297 = fVar161 * fVar85 + fVar175 * fVar248 + fVar176 * fVar267;
  fVar306 = fVar161 * fVar126 + fVar175 * fVar256 + fVar176 * fVar276;
  fVar308 = fVar161 * fVar128 + fVar175 * fVar257 + fVar176 * fVar277;
  fVar310 = fVar161 * (float)(auVar136._12_4_ >> 0x18) +
            fVar175 * (float)(auVar218._12_4_ >> 0x18) + fVar176 * (float)(auVar221._12_4_ >> 0x18);
  fVar216 = fVar161 * fVar325 + fVar175 * fVar279 + fVar176 * fVar239;
  fVar237 = fVar161 * fVar331 + fVar175 * fVar292 + fVar176 * fVar246;
  fVar238 = fVar161 * fVar332 + fVar175 * fVar294 + fVar176 * fVar247;
  fVar161 = fVar161 * (float)(auVar224._12_4_ >> 0x18) +
            fVar175 * (float)(auVar227._12_4_ >> 0x18) + fVar176 * (float)(auVar230._12_4_ >> 0x18);
  fVar258 = fVar84 * fVar178 + fVar205 * fVar203 + fVar258 * fVar204;
  fVar265 = fVar125 * fVar178 + fVar214 * fVar203 + fVar265 * fVar204;
  fVar266 = fVar127 * fVar178 + fVar215 * fVar203 + fVar266 * fVar204;
  fVar160 = (float)(auVar163._12_4_ >> 0x18) * fVar178 +
            (float)(auVar130._12_4_ >> 0x18) * fVar203 + (float)(auVar133._12_4_ >> 0x18) * fVar204;
  fVar267 = fVar85 * fVar178 + fVar248 * fVar203 + fVar267 * fVar204;
  fVar276 = fVar126 * fVar178 + fVar256 * fVar203 + fVar276 * fVar204;
  fVar277 = fVar128 * fVar178 + fVar257 * fVar203 + fVar277 * fVar204;
  fVar177 = (float)(auVar136._12_4_ >> 0x18) * fVar178 +
            (float)(auVar218._12_4_ >> 0x18) * fVar203 + (float)(auVar221._12_4_ >> 0x18) * fVar204;
  fVar325 = fVar178 * fVar325 + fVar203 * fVar279 + fVar204 * fVar239;
  fVar292 = fVar178 * fVar331 + fVar203 * fVar292 + fVar204 * fVar246;
  fVar294 = fVar178 * fVar332 + fVar203 * fVar294 + fVar204 * fVar247;
  fVar331 = fVar178 * (float)(auVar224._12_4_ >> 0x18) +
            fVar203 * (float)(auVar227._12_4_ >> 0x18) + fVar204 * (float)(auVar230._12_4_ >> 0x18);
  fVar176 = (float)DAT_01f80d30;
  fVar84 = DAT_01f80d30._4_4_;
  fVar85 = DAT_01f80d30._8_4_;
  fVar125 = DAT_01f80d30._12_4_;
  uVar79 = -(uint)(fVar176 <= ABS(fVar312));
  uVar80 = -(uint)(fVar84 <= ABS(fVar319));
  uVar81 = -(uint)(fVar85 <= ABS(fVar321));
  uVar82 = -(uint)(fVar125 <= ABS(fVar323));
  auVar314._0_4_ = (uint)fVar312 & uVar79;
  auVar314._4_4_ = (uint)fVar319 & uVar80;
  auVar314._8_4_ = (uint)fVar321 & uVar81;
  auVar314._12_4_ = (uint)fVar323 & uVar82;
  auVar179._0_4_ = ~uVar79 & (uint)fVar176;
  auVar179._4_4_ = ~uVar80 & (uint)fVar84;
  auVar179._8_4_ = ~uVar81 & (uint)fVar85;
  auVar179._12_4_ = ~uVar82 & (uint)fVar125;
  auVar179 = auVar179 | auVar314;
  uVar79 = -(uint)(fVar176 <= ABS(fVar297));
  uVar80 = -(uint)(fVar84 <= ABS(fVar306));
  uVar81 = -(uint)(fVar85 <= ABS(fVar308));
  uVar82 = -(uint)(fVar125 <= ABS(fVar310));
  auVar298._0_4_ = (uint)fVar297 & uVar79;
  auVar298._4_4_ = (uint)fVar306 & uVar80;
  auVar298._8_4_ = (uint)fVar308 & uVar81;
  auVar298._12_4_ = (uint)fVar310 & uVar82;
  auVar240._0_4_ = ~uVar79 & (uint)fVar176;
  auVar240._4_4_ = ~uVar80 & (uint)fVar84;
  auVar240._8_4_ = ~uVar81 & (uint)fVar85;
  auVar240._12_4_ = ~uVar82 & (uint)fVar125;
  auVar240 = auVar240 | auVar298;
  uVar79 = -(uint)(fVar176 <= ABS(fVar216));
  uVar80 = -(uint)(fVar84 <= ABS(fVar237));
  uVar81 = -(uint)(fVar85 <= ABS(fVar238));
  uVar82 = -(uint)(fVar125 <= ABS(fVar161));
  auVar232._0_4_ = (uint)fVar216 & uVar79;
  auVar232._4_4_ = (uint)fVar237 & uVar80;
  auVar232._8_4_ = (uint)fVar238 & uVar81;
  auVar232._12_4_ = (uint)fVar161 & uVar82;
  auVar249._0_4_ = ~uVar79 & (uint)fVar176;
  auVar249._4_4_ = ~uVar80 & (uint)fVar84;
  auVar249._8_4_ = ~uVar81 & (uint)fVar85;
  auVar249._12_4_ = ~uVar82 & (uint)fVar125;
  auVar249 = auVar249 | auVar232;
  auVar86 = rcpps(_DAT_01f80d30,auVar179);
  fVar176 = auVar86._0_4_;
  fVar125 = auVar86._4_4_;
  fVar205 = auVar86._8_4_;
  fVar248 = auVar86._12_4_;
  fVar176 = (1.0 - auVar179._0_4_ * fVar176) * fVar176 + fVar176;
  fVar125 = (1.0 - auVar179._4_4_ * fVar125) * fVar125 + fVar125;
  fVar205 = (1.0 - auVar179._8_4_ * fVar205) * fVar205 + fVar205;
  fVar248 = (1.0 - auVar179._12_4_ * fVar248) * fVar248 + fVar248;
  auVar86 = rcpps(auVar86,auVar240);
  fVar84 = auVar86._0_4_;
  fVar126 = auVar86._4_4_;
  fVar214 = auVar86._8_4_;
  fVar256 = auVar86._12_4_;
  fVar84 = (1.0 - auVar240._0_4_ * fVar84) * fVar84 + fVar84;
  fVar126 = (1.0 - auVar240._4_4_ * fVar126) * fVar126 + fVar126;
  fVar214 = (1.0 - auVar240._8_4_ * fVar214) * fVar214 + fVar214;
  fVar256 = (1.0 - auVar240._12_4_ * fVar256) * fVar256 + fVar256;
  auVar86 = rcpps(auVar86,auVar249);
  fVar85 = auVar86._0_4_;
  fVar127 = auVar86._4_4_;
  fVar215 = auVar86._8_4_;
  fVar257 = auVar86._12_4_;
  fVar85 = (1.0 - auVar249._0_4_ * fVar85) * fVar85 + fVar85;
  fVar127 = (1.0 - auVar249._4_4_ * fVar127) * fVar127 + fVar127;
  fVar215 = (1.0 - auVar249._8_4_ * fVar215) * fVar215 + fVar215;
  fVar257 = (1.0 - auVar249._12_4_ * fVar257) * fVar257 + fVar257;
  fVar279 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar77 = *(ulong *)(prim + uVar64 * 7 + 6);
  uVar124 = (undefined2)(uVar77 >> 0x30);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar77;
  auVar260._12_2_ = uVar124;
  auVar260._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar77 >> 0x20);
  auVar87._12_4_ = auVar260._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar77;
  auVar87._10_2_ = uVar124;
  auVar285._10_6_ = auVar87._10_6_;
  auVar285._8_2_ = uVar124;
  auVar285._0_8_ = uVar77;
  uVar124 = (undefined2)(uVar77 >> 0x10);
  auVar50._4_8_ = auVar285._8_8_;
  auVar50._2_2_ = uVar124;
  auVar50._0_2_ = uVar124;
  fVar128 = (float)(auVar50._0_4_ >> 0x10);
  fVar216 = (float)(auVar285._8_4_ >> 0x10);
  uVar75 = *(ulong *)(prim + uVar64 * 0xb + 6);
  uVar124 = (undefined2)(uVar75 >> 0x30);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar75;
  auVar182._12_2_ = uVar124;
  auVar182._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar75 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar75;
  auVar181._10_2_ = uVar124;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar124;
  auVar180._0_8_ = uVar75;
  uVar124 = (undefined2)(uVar75 >> 0x10);
  auVar51._4_8_ = auVar180._8_8_;
  auVar51._2_2_ = uVar124;
  auVar51._0_2_ = uVar124;
  uVar10 = *(ulong *)(prim + uVar64 * 9 + 6);
  uVar124 = (undefined2)(uVar10 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar10;
  auVar90._12_2_ = uVar124;
  auVar90._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar10 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar10;
  auVar89._10_2_ = uVar124;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar124;
  auVar88._0_8_ = uVar10;
  uVar124 = (undefined2)(uVar10 >> 0x10);
  auVar52._4_8_ = auVar88._8_8_;
  auVar52._2_2_ = uVar124;
  auVar52._0_2_ = uVar124;
  fVar161 = (float)(auVar52._0_4_ >> 0x10);
  fVar237 = (float)(auVar88._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar64 * 0xd + 6);
  uVar124 = (undefined2)(uVar11 >> 0x30);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar11;
  auVar252._12_2_ = uVar124;
  auVar252._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar11 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar11;
  auVar251._10_2_ = uVar124;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar124;
  auVar250._0_8_ = uVar11;
  uVar124 = (undefined2)(uVar11 >> 0x10);
  auVar53._4_8_ = auVar250._8_8_;
  auVar53._2_2_ = uVar124;
  auVar53._0_2_ = uVar124;
  uVar12 = *(ulong *)(prim + uVar64 * 0x12 + 6);
  uVar124 = (undefined2)(uVar12 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar12;
  auVar93._12_2_ = uVar124;
  auVar93._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar12 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar12;
  auVar92._10_2_ = uVar124;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar124;
  auVar91._0_8_ = uVar12;
  uVar124 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar91._8_8_;
  auVar54._2_2_ = uVar124;
  auVar54._0_2_ = uVar124;
  fVar175 = (float)(auVar54._0_4_ >> 0x10);
  fVar238 = (float)(auVar91._8_4_ >> 0x10);
  uVar72 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar64 * 2 + uVar72 + 6);
  uVar124 = (undefined2)(uVar13 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar13;
  auVar270._12_2_ = uVar124;
  auVar270._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar13 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar13;
  auVar269._10_2_ = uVar124;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar124;
  auVar268._0_8_ = uVar13;
  uVar124 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar268._8_8_;
  auVar55._2_2_ = uVar124;
  auVar55._0_2_ = uVar124;
  uVar72 = *(ulong *)(prim + uVar72 + 6);
  uVar124 = (undefined2)(uVar72 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar72;
  auVar96._12_2_ = uVar124;
  auVar96._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar72 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar72;
  auVar95._10_2_ = uVar124;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar124;
  auVar94._0_8_ = uVar72;
  uVar124 = (undefined2)(uVar72 >> 0x10);
  auVar56._4_8_ = auVar94._8_8_;
  auVar56._2_2_ = uVar124;
  auVar56._0_2_ = uVar124;
  fVar178 = (float)(auVar56._0_4_ >> 0x10);
  fVar239 = (float)(auVar94._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar64 * 0x18 + 6);
  uVar124 = (undefined2)(uVar14 >> 0x30);
  auVar282._8_4_ = 0;
  auVar282._0_8_ = uVar14;
  auVar282._12_2_ = uVar124;
  auVar282._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar14 >> 0x20);
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar14;
  auVar281._10_2_ = uVar124;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._8_2_ = uVar124;
  auVar280._0_8_ = uVar14;
  uVar124 = (undefined2)(uVar14 >> 0x10);
  auVar57._4_8_ = auVar280._8_8_;
  auVar57._2_2_ = uVar124;
  auVar57._0_2_ = uVar124;
  uVar15 = *(ulong *)(prim + uVar64 * 0x1d + 6);
  uVar124 = (undefined2)(uVar15 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar15;
  auVar99._12_2_ = uVar124;
  auVar99._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar15 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar15;
  auVar98._10_2_ = uVar124;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar124;
  auVar97._0_8_ = uVar15;
  uVar124 = (undefined2)(uVar15 >> 0x10);
  auVar58._4_8_ = auVar97._8_8_;
  auVar58._2_2_ = uVar124;
  auVar58._0_2_ = uVar124;
  fVar203 = (float)(auVar58._0_4_ >> 0x10);
  fVar246 = (float)(auVar97._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar124 = (undefined2)(uVar16 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar16;
  auVar301._12_2_ = uVar124;
  auVar301._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar16 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar16;
  auVar300._10_2_ = uVar124;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar124;
  auVar299._0_8_ = uVar16;
  uVar124 = (undefined2)(uVar16 >> 0x10);
  auVar59._4_8_ = auVar299._8_8_;
  auVar59._2_2_ = uVar124;
  auVar59._0_2_ = uVar124;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar64) + 6);
  uVar124 = (undefined2)(uVar17 >> 0x30);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar17;
  auVar102._12_2_ = uVar124;
  auVar102._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar17 >> 0x20);
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar17;
  auVar101._10_2_ = uVar124;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._8_2_ = uVar124;
  auVar100._0_8_ = uVar17;
  uVar124 = (undefined2)(uVar17 >> 0x10);
  auVar60._4_8_ = auVar100._8_8_;
  auVar60._2_2_ = uVar124;
  auVar60._0_2_ = uVar124;
  fVar204 = (float)(auVar60._0_4_ >> 0x10);
  fVar247 = (float)(auVar100._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar64 * 0x23 + 6);
  uVar124 = (undefined2)(uVar64 >> 0x30);
  auVar317._8_4_ = 0;
  auVar317._0_8_ = uVar64;
  auVar317._12_2_ = uVar124;
  auVar317._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar64 >> 0x20);
  auVar316._12_4_ = auVar317._12_4_;
  auVar316._8_2_ = 0;
  auVar316._0_8_ = uVar64;
  auVar316._10_2_ = uVar124;
  auVar315._10_6_ = auVar316._10_6_;
  auVar315._8_2_ = uVar124;
  auVar315._0_8_ = uVar64;
  uVar124 = (undefined2)(uVar64 >> 0x10);
  auVar61._4_8_ = auVar315._8_8_;
  auVar61._2_2_ = uVar124;
  auVar61._0_2_ = uVar124;
  auVar183._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar128) * fVar279 + fVar128) - fVar265) *
                fVar125,((((float)(int)(short)uVar75 - (float)(int)(short)uVar77) * fVar279 +
                         (float)(int)(short)uVar77) - fVar258) * fVar176);
  auVar183._8_4_ =
       ((((float)(auVar180._8_4_ >> 0x10) - fVar216) * fVar279 + fVar216) - fVar266) * fVar205;
  auVar183._12_4_ =
       ((((float)(auVar181._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar160) * fVar248;
  auVar253._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar279 +
        (float)(int)(short)uVar10) - fVar258) * fVar176;
  auVar253._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar161) * fVar279 + fVar161) - fVar265) * fVar125;
  auVar253._8_4_ =
       ((((float)(auVar250._8_4_ >> 0x10) - fVar237) * fVar279 + fVar237) - fVar266) * fVar205;
  auVar253._12_4_ =
       ((((float)(auVar251._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar160) * fVar248;
  auVar271._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar175) * fVar279 + fVar175) - fVar276) *
                fVar126,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar279 +
                         (float)(int)(short)uVar12) - fVar267) * fVar84);
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar238) * fVar279 + fVar238) - fVar277) * fVar214;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar177) * fVar256;
  auVar283._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar72) * fVar279 +
        (float)(int)(short)uVar72) - fVar267) * fVar84;
  auVar283._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar178) * fVar279 + fVar178) - fVar276) * fVar126;
  auVar283._8_4_ =
       ((((float)(auVar280._8_4_ >> 0x10) - fVar239) * fVar279 + fVar239) - fVar277) * fVar214;
  auVar283._12_4_ =
       ((((float)(auVar281._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar177) * fVar256;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar302._0_8_ =
       CONCAT44(((((float)(auVar59._0_4_ >> 0x10) - fVar203) * fVar279 + fVar203) - fVar292) *
                fVar127,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar279 +
                         (float)(int)(short)uVar15) - fVar325) * fVar85);
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar246) * fVar279 + fVar246) - fVar294) * fVar215;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar331) * fVar257;
  auVar318._0_4_ =
       ((((float)(int)(short)uVar64 - (float)(int)(short)uVar17) * fVar279 +
        (float)(int)(short)uVar17) - fVar325) * fVar85;
  auVar318._4_4_ =
       ((((float)(auVar61._0_4_ >> 0x10) - fVar204) * fVar279 + fVar204) - fVar292) * fVar127;
  auVar318._8_4_ =
       ((((float)(auVar315._8_4_ >> 0x10) - fVar247) * fVar279 + fVar247) - fVar294) * fVar215;
  auVar318._12_4_ =
       ((((float)(auVar316._12_4_ >> 0x10) - (float)(auVar101._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar101._12_4_ >> 0x10)) - fVar331) * fVar257;
  auVar162._8_4_ = auVar183._8_4_;
  auVar162._0_8_ = auVar183._0_8_;
  auVar162._12_4_ = auVar183._12_4_;
  auVar163 = minps(auVar162,auVar253);
  auVar138._8_4_ = auVar271._8_4_;
  auVar138._0_8_ = auVar271._0_8_;
  auVar138._12_4_ = auVar271._12_4_;
  auVar86 = minps(auVar138,auVar283);
  auVar163 = maxps(auVar163,auVar86);
  auVar139._8_4_ = auVar302._8_4_;
  auVar139._0_8_ = auVar302._0_8_;
  auVar139._12_4_ = auVar302._12_4_;
  auVar86 = minps(auVar139,auVar318);
  auVar103._4_4_ = uVar63;
  auVar103._0_4_ = uVar63;
  auVar103._8_4_ = uVar63;
  auVar103._12_4_ = uVar63;
  auVar86 = maxps(auVar86,auVar103);
  auVar86 = maxps(auVar163,auVar86);
  auVar163 = maxps(auVar183,auVar253);
  auVar272 = maxps(auVar271,auVar283);
  auVar163 = minps(auVar163,auVar272);
  local_228 = auVar86._0_4_ * 0.99999964;
  fStack_224 = auVar86._4_4_ * 0.99999964;
  fStack_220 = auVar86._8_4_ * 0.99999964;
  fStack_21c = auVar86._12_4_ * 0.99999964;
  auVar86 = maxps(auVar302,auVar318);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar104._4_4_ = uVar63;
  auVar104._0_4_ = uVar63;
  auVar104._8_4_ = uVar63;
  auVar104._12_4_ = uVar63;
  auVar86 = minps(auVar86,auVar104);
  auVar86 = minps(auVar163,auVar86);
  uVar79 = (uint)(byte)PVar18;
  auVar140._0_4_ = -(uint)(uVar79 != 0 && local_228 <= auVar86._0_4_ * 1.0000004);
  auVar140._4_4_ = -(uint)(1 < uVar79 && fStack_224 <= auVar86._4_4_ * 1.0000004);
  auVar140._8_4_ = -(uint)(2 < uVar79 && fStack_220 <= auVar86._8_4_ * 1.0000004);
  auVar140._12_4_ = -(uint)(3 < uVar79 && fStack_21c <= auVar86._12_4_ * 1.0000004);
  uVar79 = movmskps(uVar79,auVar140);
  if (uVar79 == 0) {
    return false;
  }
  uVar79 = uVar79 & 0xff;
  local_1f8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1f8._12_4_ = 0;
  local_498 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3e8 = prim;
LAB_00b00183:
  local_3e0 = (ulong)uVar79;
  lVar22 = 0;
  if (local_3e0 != 0) {
    for (; (uVar79 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
    }
  }
  uVar79 = *(uint *)(local_3e8 + 2);
  uVar80 = *(uint *)(local_3e8 + lVar22 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar79].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar80 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar176 = pGVar19->fnumTimeSegments;
  fVar84 = (pGVar19->time_range).lower;
  fVar85 = ((*(float *)(ray + k * 4 + 0x70) - fVar84) / ((pGVar19->time_range).upper - fVar84)) *
           fVar176;
  fVar84 = floorf(fVar85);
  fVar176 = fVar176 + -1.0;
  if (fVar176 <= fVar84) {
    fVar84 = fVar176;
  }
  fVar176 = 0.0;
  if (0.0 <= fVar84) {
    fVar176 = fVar84;
  }
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)fVar176 * 0x38;
  lVar22 = *(long *)(_Var20 + 0x10 + lVar73);
  lVar65 = *(long *)(_Var20 + 0x38 + lVar73);
  lVar21 = *(long *)(_Var20 + 0x48 + lVar73);
  pfVar1 = (float *)(lVar65 + uVar77 * lVar21);
  pfVar2 = (float *)(lVar65 + (uVar77 + 1) * lVar21);
  pfVar3 = (float *)(lVar65 + (uVar77 + 2) * lVar21);
  fVar85 = fVar85 - fVar176;
  fVar203 = 1.0 - fVar85;
  pfVar4 = (float *)(lVar65 + lVar21 * (uVar77 + 3));
  pRVar71 = *(RTCIntersectArguments **)(_Var20 + lVar73);
  lVar65 = lVar22 * (uVar77 + 3);
  ppSVar5 = (Scene **)((long)&pRVar71->flags + lVar22 * uVar77);
  ppSVar6 = (Scene **)((long)&pRVar71->flags + lVar22 * (uVar77 + 1));
  ppSVar7 = (Scene **)((long)&pRVar71->flags + lVar22 * (uVar77 + 2));
  local_2e8 = *(float *)ppSVar5 * fVar203 + *pfVar1 * fVar85;
  local_2f8 = *(float *)((long)ppSVar5 + 4) * fVar203 + pfVar1[1] * fVar85;
  local_158 = *(float *)(ppSVar5 + 1) * fVar203 + pfVar1[2] * fVar85;
  local_318 = *(float *)ppSVar6 * fVar203 + *pfVar2 * fVar85;
  local_328 = *(float *)((long)ppSVar6 + 4) * fVar203 + pfVar2[1] * fVar85;
  local_338 = *(float *)(ppSVar6 + 1) * fVar203 + pfVar2[2] * fVar85;
  local_348 = *(float *)ppSVar7 * fVar203 + *pfVar3 * fVar85;
  local_358 = *(float *)((long)ppSVar7 + 4) * fVar203 + pfVar3[1] * fVar85;
  local_368 = *(float *)(ppSVar7 + 1) * fVar203 + pfVar3[2] * fVar85;
  ppSVar8 = (Scene **)((long)&pRVar71->flags + lVar65);
  local_178 = fVar203 * *(float *)ppSVar8 + fVar85 * *pfVar4;
  local_188 = fVar203 * *(float *)((long)ppSVar8 + 4) + fVar85 * pfVar4[1];
  local_388 = fVar203 * *(float *)(ppSVar8 + 1) + fVar85 * pfVar4[2];
  fVar176 = *(float *)(ray + k * 4 + 0x40);
  fVar84 = *(float *)(ray + k * 4 + 0x50);
  fVar126 = *(float *)(ray + k * 4 + 0x60);
  fVar125 = fVar84 * fVar84;
  fVar127 = fVar126 * fVar126;
  fVar128 = fVar125 + fVar176 * fVar176 + fVar127;
  auVar105._0_8_ = CONCAT44(fVar125 + fVar125 + 0.0,fVar128);
  auVar105._8_4_ = fVar125 + fVar127 + fVar127;
  auVar105._12_4_ = fVar125 + 0.0 + 0.0;
  auVar233._8_4_ = auVar105._8_4_;
  auVar233._0_8_ = auVar105._0_8_;
  auVar233._12_4_ = auVar105._12_4_;
  auVar86 = rcpss(auVar233,auVar105);
  fVar178 = (2.0 - auVar86._0_4_ * fVar128) * auVar86._0_4_ *
            (((local_158 + local_338 + local_368 + local_388) * 0.25 -
             *(float *)(ray + k * 4 + 0x20)) * fVar126 +
            ((local_2f8 + local_328 + local_358 + local_188) * 0.25 - *(float *)(ray + k * 4 + 0x10)
            ) * fVar84 +
            ((local_2e8 + local_318 + local_348 + local_178) * 0.25 - *(float *)(ray + k * 4)) *
            fVar176);
  fVar125 = fVar176 * fVar178 + *(float *)(ray + k * 4);
  fVar161 = fVar84 * fVar178 + *(float *)(ray + k * 4 + 0x10);
  fVar175 = fVar126 * fVar178 + *(float *)(ray + k * 4 + 0x20);
  local_2e8 = local_2e8 - fVar125;
  local_2f8 = local_2f8 - fVar161;
  local_158 = local_158 - fVar175;
  fStack_45c = (*(float *)((long)ppSVar5 + 0xc) * fVar203 + pfVar1[3] * fVar85) - 0.0;
  local_348 = local_348 - fVar125;
  local_358 = local_358 - fVar161;
  local_368 = local_368 - fVar175;
  fStack_47c = (*(float *)((long)ppSVar7 + 0xc) * fVar203 + pfVar3[3] * fVar85) - 0.0;
  local_318 = local_318 - fVar125;
  local_328 = local_328 - fVar161;
  local_338 = local_338 - fVar175;
  fStack_46c = (*(float *)((long)ppSVar6 + 0xc) * fVar203 + pfVar2[3] * fVar85) - 0.0;
  local_178 = local_178 - fVar125;
  local_188 = local_188 - fVar161;
  local_388 = local_388 - fVar175;
  fStack_44c = (fVar203 * *(float *)((long)ppSVar8 + 0xc) + fVar85 * pfVar4[3]) - 0.0;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fVar85 = fVar84 * fVar84;
  local_468 = local_2e8;
  fStack_464 = local_2f8;
  fStack_460 = local_158;
  local_308 = fStack_45c;
  fStack_304 = fStack_45c;
  fStack_300 = fStack_45c;
  fStack_2fc = fStack_45c;
  fStack_13c = fVar176 * fVar176;
  local_148 = fStack_13c + fVar85 + fVar127;
  fStack_144 = fStack_13c + fVar85 + fVar127;
  fStack_140 = fStack_13c + fVar85 + fVar127;
  fStack_13c = fStack_13c + fVar85 + fVar127;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_324 = local_328;
  fStack_320 = local_328;
  fStack_31c = local_328;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_478 = local_318;
  fStack_474 = local_328;
  fStack_470 = local_338;
  local_168 = fStack_46c;
  fStack_164 = fStack_46c;
  fStack_160 = fStack_46c;
  fStack_15c = fStack_46c;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  fStack_354 = local_358;
  fStack_350 = local_358;
  fStack_34c = local_358;
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  local_488 = local_348;
  fStack_484 = local_358;
  fStack_480 = local_368;
  local_378 = fStack_47c;
  fStack_374 = fStack_47c;
  fStack_370 = fStack_47c;
  fStack_36c = fStack_47c;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_384 = local_388;
  fStack_380 = local_388;
  fStack_37c = local_388;
  local_458 = local_178;
  fStack_454 = local_188;
  fStack_450 = local_388;
  local_398 = fStack_44c;
  fStack_394 = fStack_44c;
  fStack_390 = fStack_44c;
  fStack_38c = fStack_44c;
  fVar85 = *(float *)(ray + k * 4 + 0x40);
  local_528 = fVar126;
  fStack_524 = fVar126;
  fStack_520 = fVar126;
  fStack_51c = fVar126;
  local_3a8 = ABS(local_148);
  fStack_3a4 = ABS(fStack_144);
  fStack_3a0 = ABS(fStack_140);
  fStack_39c = ABS(fStack_13c);
  fVar125 = *(float *)(ray + k * 4 + 0x30);
  local_418 = ZEXT416((uint)fVar178);
  local_1e8 = fVar125 - fVar178;
  fStack_1e4 = local_1e8;
  fStack_1e0 = local_1e8;
  fStack_1dc = local_1e8;
  local_490 = (ulong)uVar79;
  local_3c8 = uVar79;
  uStack_3c4 = uVar79;
  uStack_3c0 = uVar79;
  uStack_3bc = uVar79;
  local_3d8 = uVar80;
  uStack_3d4 = uVar80;
  uStack_3d0 = uVar80;
  uStack_3cc = uVar80;
  uVar77 = 0;
  bVar74 = false;
  fVar127 = 1.4013e-45;
  local_1d8 = 0.0;
  fStack_1d4 = 1.0;
  do {
    uVar63 = SUB84(pRVar71,0);
    iVar76 = (int)uVar77;
    local_678._4_4_ = fStack_1d4 - local_1d8;
    fVar205 = (float)local_678._4_4_ * 0.11111111;
    uStack_1d0 = 0;
    uStack_1cc = 0;
    local_678._0_4_ = local_678._4_4_;
    fStack_670 = (float)local_678._4_4_;
    fStack_66c = (float)local_678._4_4_;
    local_518 = local_1d8;
    fStack_514 = local_1d8;
    fStack_510 = local_1d8;
    fStack_50c = local_1d8;
    fVar279 = (float)local_678._4_4_ * 0.0 + local_1d8;
    fVar292 = (float)local_678._4_4_ * 0.33333334 + local_1d8;
    fVar312 = (float)local_678._4_4_ * 0.6666667 + local_1d8;
    fVar319 = (float)local_678._4_4_ * 1.0 + local_1d8;
    fVar160 = 1.0 - fVar279;
    fVar267 = 1.0 - fVar292;
    fVar277 = 1.0 - fVar312;
    fVar177 = 1.0 - fVar319;
    fVar161 = fVar279 * fVar160;
    fVar175 = fVar292 * fVar267;
    fVar203 = fVar312 * fVar277;
    fVar204 = fVar319 * fVar177;
    fVar214 = fVar160 * fVar160 * fVar160;
    fVar216 = fVar267 * fVar267 * fVar267;
    fVar238 = fVar277 * fVar277 * fVar277;
    fVar239 = fVar177 * fVar177 * fVar177;
    fVar325 = fVar279 * fVar279 * fVar279;
    fVar331 = fVar292 * fVar292 * fVar292;
    fVar332 = fVar312 * fVar312 * fVar312;
    fVar278 = fVar319 * fVar319 * fVar319;
    fVar215 = fVar214 * 0.16666667;
    fVar237 = fVar216 * 0.16666667;
    fVar246 = fVar238 * 0.16666667;
    fVar247 = fVar239 * 0.16666667;
    fVar276 = (fVar279 * fVar161 * 6.0 + fVar160 * fVar161 * 12.0 + fVar214 * 4.0 + fVar325) *
              0.16666667;
    fVar310 = (fVar292 * fVar175 * 6.0 + fVar267 * fVar175 * 12.0 + fVar216 * 4.0 + fVar331) *
              0.16666667;
    fVar321 = (fVar312 * fVar203 * 6.0 + fVar277 * fVar203 * 12.0 + fVar238 * 4.0 + fVar332) *
              0.16666667;
    fVar323 = (fVar319 * fVar204 * 6.0 + fVar177 * fVar204 * 12.0 + fVar239 * 4.0 + fVar278) *
              0.16666667;
    fVar214 = (fVar160 * fVar161 * 6.0 + fVar279 * fVar161 * 12.0 + fVar325 * 4.0 + fVar214) *
              0.16666667;
    fVar216 = (fVar267 * fVar175 * 6.0 + fVar292 * fVar175 * 12.0 + fVar331 * 4.0 + fVar216) *
              0.16666667;
    fVar257 = (fVar277 * fVar203 * 6.0 + fVar312 * fVar203 * 12.0 + fVar332 * 4.0 + fVar238) *
              0.16666667;
    fVar265 = (fVar177 * fVar204 * 6.0 + fVar319 * fVar204 * 12.0 + fVar278 * 4.0 + fVar239) *
              0.16666667;
    fVar325 = fVar325 * 0.16666667;
    fVar331 = fVar331 * 0.16666667;
    fVar332 = fVar332 * 0.16666667;
    fVar278 = fVar278 * 0.16666667;
    fVar294 = local_2e8 * fVar215 + local_318 * fVar276 + local_348 * fVar214 + local_178 * fVar325;
    fVar297 = fStack_2e4 * fVar237 +
              fStack_314 * fVar310 + fStack_344 * fVar216 + fStack_174 * fVar331;
    fVar306 = fStack_2e0 * fVar246 +
              fStack_310 * fVar321 + fStack_340 * fVar257 + fStack_170 * fVar332;
    fVar308 = fStack_2dc * fVar247 +
              fStack_30c * fVar323 + fStack_33c * fVar265 + fStack_16c * fVar278;
    fVar333 = local_2f8 * fVar215 + local_328 * fVar276 + local_358 * fVar214 + local_188 * fVar325;
    fVar335 = fStack_2f4 * fVar237 +
              fStack_324 * fVar310 + fStack_354 * fVar216 + fStack_184 * fVar331;
    fVar336 = fStack_2f0 * fVar246 +
              fStack_320 * fVar321 + fStack_350 * fVar257 + fStack_180 * fVar332;
    fVar337 = fStack_2ec * fVar247 +
              fStack_31c * fVar323 + fStack_34c * fVar265 + fStack_17c * fVar278;
    fVar248 = local_158 * fVar215 + local_338 * fVar276 + local_368 * fVar214 + local_388 * fVar325;
    fVar256 = fStack_154 * fVar237 +
              fStack_334 * fVar310 + fStack_364 * fVar216 + fStack_384 * fVar331;
    fVar258 = fStack_150 * fVar246 +
              fStack_330 * fVar321 + fStack_360 * fVar257 + fStack_380 * fVar332;
    fVar266 = fStack_14c * fVar247 +
              fStack_32c * fVar323 + fStack_35c * fVar265 + fStack_37c * fVar278;
    fVar238 = fVar215 * local_308 + fVar276 * local_168 + fVar214 * local_378 + fVar325 * local_398;
    fVar239 = fVar237 * fStack_304 +
              fVar310 * fStack_164 + fVar216 * fStack_374 + fVar331 * fStack_394;
    auVar164._0_8_ = CONCAT44(fVar239,fVar238);
    auVar164._8_4_ =
         fVar246 * fStack_300 + fVar321 * fStack_160 + fVar257 * fStack_370 + fVar332 * fStack_390;
    auVar164._12_4_ =
         fVar247 * fStack_2fc + fVar323 * fStack_15c + fVar265 * fStack_36c + fVar278 * fStack_38c;
    fVar214 = -fVar160 * fVar160 * 0.5;
    fVar215 = -fVar267 * fVar267 * 0.5;
    fVar216 = -fVar277 * fVar277 * 0.5;
    fVar237 = -fVar177 * fVar177 * 0.5;
    fVar276 = (-fVar279 * fVar279 - fVar161 * 4.0) * 0.5;
    fVar246 = (-fVar292 * fVar292 - fVar175 * 4.0) * 0.5;
    fVar247 = (-fVar312 * fVar312 - fVar203 * 4.0) * 0.5;
    fVar257 = (-fVar319 * fVar319 - fVar204 * 4.0) * 0.5;
    fVar161 = (fVar161 * 4.0 + fVar160 * fVar160) * 0.5;
    fVar175 = (fVar175 * 4.0 + fVar267 * fVar267) * 0.5;
    fVar203 = (fVar203 * 4.0 + fVar277 * fVar277) * 0.5;
    fVar204 = (fVar204 * 4.0 + fVar177 * fVar177) * 0.5;
    fVar310 = fVar279 * fVar279 * 0.5;
    fVar265 = fVar292 * fVar292 * 0.5;
    fVar160 = fVar312 * fVar312 * 0.5;
    fVar267 = fVar319 * fVar319 * 0.5;
    fVar325 = (local_2e8 * fVar214 + local_318 * fVar276 + local_348 * fVar161 + local_178 * fVar310
              ) * fVar205;
    local_508._0_4_ =
         (fStack_2e4 * fVar215 + fStack_314 * fVar246 + fStack_344 * fVar175 + fStack_174 * fVar265)
         * fVar205;
    local_508._4_4_ =
         (fStack_2e0 * fVar216 + fStack_310 * fVar247 + fStack_340 * fVar203 + fStack_170 * fVar160)
         * fVar205;
    fStack_500 = (fStack_2dc * fVar237 +
                 fStack_30c * fVar257 + fStack_33c * fVar204 + fStack_16c * fVar267) * fVar205;
    fVar331 = (local_2f8 * fVar214 + local_328 * fVar276 + local_358 * fVar161 + local_188 * fVar310
              ) * fVar205;
    fVar278 = (fStack_2f4 * fVar215 +
              fStack_324 * fVar246 + fStack_354 * fVar175 + fStack_184 * fVar265) * fVar205;
    local_4b8._0_8_ = CONCAT44(fVar278,fVar331);
    local_4b8._8_4_ =
         (fStack_2f0 * fVar216 + fStack_320 * fVar247 + fStack_350 * fVar203 + fStack_180 * fVar160)
         * fVar205;
    local_4b8._12_4_ =
         (fStack_2ec * fVar237 + fStack_31c * fVar257 + fStack_34c * fVar204 + fStack_17c * fVar267)
         * fVar205;
    local_4c8 = (local_158 * fVar214 +
                local_338 * fVar276 + local_368 * fVar161 + local_388 * fVar310) * fVar205;
    fStack_4c4 = (fStack_154 * fVar215 +
                 fStack_334 * fVar246 + fStack_364 * fVar175 + fStack_384 * fVar265) * fVar205;
    fStack_4c0 = (fStack_150 * fVar216 +
                 fStack_330 * fVar247 + fStack_360 * fVar203 + fStack_380 * fVar160) * fVar205;
    fStack_4bc = (fStack_14c * fVar237 +
                 fStack_32c * fVar257 + fStack_35c * fVar204 + fStack_37c * fVar267) * fVar205;
    fVar307 = fVar205 * (fVar215 * fStack_304 +
                        fVar246 * fStack_164 + fVar175 * fStack_374 + fVar265 * fStack_394);
    fVar309 = fVar205 * (fVar216 * fStack_300 +
                        fVar247 * fStack_160 + fVar203 * fStack_370 + fVar160 * fStack_390);
    fVar311 = fVar205 * (fVar237 * fStack_2fc +
                        fVar257 * fStack_15c + fVar204 * fStack_36c + fVar267 * fStack_38c);
    auVar26._4_4_ = fVar256;
    auVar26._0_4_ = fVar248;
    auVar26._8_4_ = fVar258;
    auVar26._12_4_ = fVar266;
    _local_4a8 = auVar26._4_12_;
    fStack_49c = 0.0;
    auVar326._4_4_ = auVar164._8_4_;
    auVar326._0_4_ = fVar239;
    auVar326._8_4_ = auVar164._12_4_;
    auVar326._12_4_ = 0;
    auVar254._0_8_ = CONCAT44(auVar164._8_4_ - fVar309,fVar239 - fVar307);
    auVar254._8_4_ = auVar164._12_4_ - fVar311;
    auVar254._12_4_ = 0;
    local_428._0_4_ = fVar335 - fVar333;
    local_428._4_4_ = fVar336 - fVar335;
    fStack_420 = fVar337 - fVar336;
    fStack_41c = 0.0 - fVar337;
    local_438._0_4_ = fVar256 - fVar248;
    local_438._4_4_ = fVar258 - fVar256;
    fStack_430 = fVar266 - fVar258;
    fStack_42c = 0.0 - fVar266;
    fVar312 = fVar331 * (float)local_438._0_4_ - local_4c8 * (float)local_428._0_4_;
    fVar319 = fVar278 * (float)local_438._4_4_ - fStack_4c4 * (float)local_428._4_4_;
    fVar321 = (float)local_4b8._8_4_ * fStack_430 - fStack_4c0 * fStack_420;
    fVar323 = (float)local_4b8._12_4_ * fStack_42c - fStack_4bc * fStack_41c;
    local_448 = fVar297 - fVar294;
    fStack_444 = fVar306 - fVar297;
    fStack_440 = fVar308 - fVar306;
    fStack_43c = 0.0 - fVar308;
    fVar216 = local_4c8 * local_448 - fVar325 * (float)local_438._0_4_;
    fVar246 = fStack_4c4 * fStack_444 - (float)local_508._0_4_ * (float)local_438._4_4_;
    fVar257 = fStack_4c0 * fStack_440 - (float)local_508._4_4_ * fStack_430;
    fVar160 = fStack_4bc * fStack_43c - fStack_500 * fStack_42c;
    fVar277 = fVar325 * (float)local_428._0_4_ - fVar331 * local_448;
    fVar177 = (float)local_508._0_4_ * (float)local_428._4_4_ - fVar278 * fStack_444;
    fVar279 = (float)local_508._4_4_ * fStack_420 - (float)local_4b8._8_4_ * fStack_440;
    fVar292 = fStack_500 * fStack_41c - (float)local_4b8._12_4_ * fStack_43c;
    auVar141._0_4_ = (float)local_438._0_4_ * (float)local_438._0_4_;
    auVar141._4_4_ = (float)local_438._4_4_ * (float)local_438._4_4_;
    auVar141._8_4_ = fStack_430 * fStack_430;
    auVar141._12_4_ = fStack_42c * fStack_42c;
    auVar206._0_4_ =
         local_448 * local_448 + (float)local_428._0_4_ * (float)local_428._0_4_ + auVar141._0_4_;
    auVar206._4_4_ =
         fStack_444 * fStack_444 + (float)local_428._4_4_ * (float)local_428._4_4_ + auVar141._4_4_;
    auVar206._8_4_ = fStack_440 * fStack_440 + fStack_420 * fStack_420 + auVar141._8_4_;
    auVar206._12_4_ = fStack_43c * fStack_43c + fStack_41c * fStack_41c + auVar141._12_4_;
    auVar86 = rcpps(auVar141,auVar206);
    fVar175 = auVar86._0_4_;
    fVar203 = auVar86._4_4_;
    fVar204 = auVar86._8_4_;
    fVar215 = auVar86._12_4_;
    fVar175 = (1.0 - fVar175 * auVar206._0_4_) * fVar175 + fVar175;
    fVar203 = (1.0 - fVar203 * auVar206._4_4_) * fVar203 + fVar203;
    fVar204 = (1.0 - fVar204 * auVar206._8_4_) * fVar204 + fVar204;
    fVar215 = (1.0 - fVar215 * auVar206._12_4_) * fVar215 + fVar215;
    auVar106._8_4_ = local_4b8._8_4_;
    auVar106._0_8_ = local_4b8._0_8_;
    auVar106._12_4_ = local_4b8._12_4_;
    fVar237 = (float)local_438._0_4_ * fVar278 - (float)local_428._0_4_ * fStack_4c4;
    fVar247 = (float)local_438._4_4_ * (float)local_4b8._8_4_ - (float)local_428._4_4_ * fStack_4c0;
    fVar265 = fStack_430 * (float)local_4b8._12_4_ - fStack_420 * fStack_4bc;
    fVar267 = fStack_42c * 0.0 - fStack_41c * 0.0;
    local_4e8 = fStack_4c4;
    fStack_4e4 = fStack_4c0;
    fStack_4e0 = fStack_4bc;
    fStack_4dc = 0.0;
    fVar332 = local_448 * fStack_4c4 - (float)local_438._0_4_ * (float)local_508._0_4_;
    fVar293 = fStack_444 * fStack_4c0 - (float)local_438._4_4_ * (float)local_508._4_4_;
    fVar295 = fStack_440 * fStack_4bc - fStack_430 * fStack_500;
    fVar296 = fStack_43c * 0.0 - fStack_42c * 0.0;
    _local_4d8 = auVar106 >> 0x20;
    uStack_4fc = 0;
    fVar313 = (float)local_428._0_4_ * (float)local_508._0_4_ - local_448 * fVar278;
    fVar320 = (float)local_428._4_4_ * (float)local_508._4_4_ - fStack_444 * (float)local_4b8._8_4_;
    fVar322 = fStack_420 * fStack_500 - fStack_440 * (float)local_4b8._12_4_;
    fVar324 = fStack_41c * 0.0 - fStack_43c * 0.0;
    auVar259._0_4_ = (fVar312 * fVar312 + fVar216 * fVar216 + fVar277 * fVar277) * fVar175;
    auVar259._4_4_ = (fVar319 * fVar319 + fVar246 * fVar246 + fVar177 * fVar177) * fVar203;
    auVar259._8_4_ = (fVar321 * fVar321 + fVar257 * fVar257 + fVar279 * fVar279) * fVar204;
    auVar259._12_4_ = (fVar323 * fVar323 + fVar160 * fVar160 + fVar292 * fVar292) * fVar215;
    auVar184._0_4_ = (fVar237 * fVar237 + fVar332 * fVar332 + fVar313 * fVar313) * fVar175;
    auVar184._4_4_ = (fVar247 * fVar247 + fVar293 * fVar293 + fVar320 * fVar320) * fVar203;
    auVar184._8_4_ = (fVar265 * fVar265 + fVar295 * fVar295 + fVar322 * fVar322) * fVar204;
    auVar184._12_4_ = (fVar267 * fVar267 + fVar296 * fVar296 + fVar324 * fVar324) * fVar215;
    auVar260 = maxps(auVar259,auVar184);
    auVar303._0_4_ =
         fVar205 * (fVar214 * local_308 +
                   fVar276 * local_168 + fVar161 * local_378 + fVar310 * local_398) + fVar238;
    auVar303._4_4_ = fVar307 + fVar239;
    auVar303._8_4_ = fVar309 + auVar164._8_4_;
    auVar303._12_4_ = fVar311 + auVar164._12_4_;
    auVar284._8_4_ = auVar164._8_4_;
    auVar284._0_8_ = auVar164._0_8_;
    auVar284._12_4_ = auVar164._12_4_;
    auVar163 = maxps(auVar284,auVar303);
    auVar185._8_4_ = auVar254._8_4_;
    auVar185._0_8_ = auVar254._0_8_;
    auVar185._12_4_ = 0;
    auVar86 = maxps(auVar185,auVar326);
    auVar285 = maxps(auVar163,auVar86);
    auVar86 = minps(auVar164,auVar303);
    auVar163 = minps(auVar254,auVar326);
    auVar272 = minps(auVar86,auVar163);
    auVar86 = sqrtps(auVar106 >> 0x20,auVar260);
    auVar163 = rsqrtps(auVar86,auVar206);
    fVar161 = auVar163._0_4_;
    fVar175 = auVar163._4_4_;
    fVar203 = auVar163._8_4_;
    fVar204 = auVar163._12_4_;
    fVar237 = fVar161 * 1.5 - fVar161 * fVar161 * auVar206._0_4_ * 0.5 * fVar161;
    fVar238 = fVar175 * 1.5 - fVar175 * fVar175 * auVar206._4_4_ * 0.5 * fVar175;
    auVar327._0_8_ = CONCAT44(fVar238,fVar237);
    auVar327._8_4_ = fVar203 * 1.5 - fVar203 * fVar203 * auVar206._8_4_ * 0.5 * fVar203;
    auVar327._12_4_ = fVar204 * 1.5 - fVar204 * fVar204 * auVar206._12_4_ * 0.5 * fVar204;
    fVar205 = 0.0 - fVar333;
    fVar214 = 0.0 - fVar335;
    fVar215 = 0.0 - fVar336;
    fVar216 = 0.0 - fVar337;
    local_4f8 = 0.0 - fVar248;
    fStack_4f4 = 0.0 - fVar256;
    fStack_4f0 = 0.0 - fVar258;
    fStack_4ec = 0.0 - fVar266;
    fVar161 = 0.0 - fVar294;
    fVar175 = 0.0 - fVar297;
    fVar203 = 0.0 - fVar306;
    fVar204 = 0.0 - fVar308;
    auVar334._8_4_ = auVar327._8_4_;
    auVar334._0_8_ = auVar327._0_8_;
    auVar334._12_4_ = auVar327._12_4_;
    local_198 = fVar85 * local_448 * fVar237 +
                fVar84 * (float)local_428._0_4_ * fVar237 +
                local_528 * (float)local_438._0_4_ * fVar237;
    fStack_194 = fVar85 * fStack_444 * fVar238 +
                 fVar84 * (float)local_428._4_4_ * fVar238 +
                 fStack_524 * (float)local_438._4_4_ * fVar238;
    fStack_190 = fVar85 * fStack_440 * auVar327._8_4_ +
                 fVar84 * fStack_420 * auVar327._8_4_ + fStack_520 * fStack_430 * auVar327._8_4_;
    fStack_18c = fVar85 * fStack_43c * auVar327._12_4_ +
                 fVar84 * fStack_41c * auVar327._12_4_ + fStack_51c * fStack_42c * auVar327._12_4_;
    local_1b8 = local_448 * fVar237 * fVar161 +
                (float)local_428._0_4_ * fVar237 * fVar205 +
                (float)local_438._0_4_ * fVar237 * local_4f8;
    fStack_1b4 = fStack_444 * fVar238 * fVar175 +
                 (float)local_428._4_4_ * fVar238 * fVar214 +
                 (float)local_438._4_4_ * fVar238 * fStack_4f4;
    fStack_1b0 = fStack_440 * auVar327._8_4_ * fVar203 +
                 fStack_420 * auVar327._8_4_ * fVar215 + fStack_430 * auVar327._8_4_ * fStack_4f0;
    fStack_1ac = fStack_43c * auVar327._12_4_ * fVar204 +
                 fStack_41c * auVar327._12_4_ * fVar216 + fStack_42c * auVar327._12_4_ * fStack_4ec;
    local_1c8 = (fVar85 * fVar161 + fVar84 * fVar205 + local_528 * local_4f8) -
                local_198 * local_1b8;
    fStack_1c4 = (fVar85 * fVar175 + fVar84 * fVar214 + fStack_524 * fStack_4f4) -
                 fStack_194 * fStack_1b4;
    fStack_1c0 = (fVar85 * fVar203 + fVar84 * fVar215 + fStack_520 * fStack_4f0) -
                 fStack_190 * fStack_1b0;
    fStack_1bc = (fVar85 * fVar204 + fVar84 * fVar216 + fStack_51c * fStack_4ec) -
                 fStack_18c * fStack_1ac;
    fVar277 = (fVar161 * fVar161 + fVar205 * fVar205 + local_4f8 * local_4f8) -
              local_1b8 * local_1b8;
    fVar177 = (fVar175 * fVar175 + fVar214 * fVar214 + fStack_4f4 * fStack_4f4) -
              fStack_1b4 * fStack_1b4;
    fVar279 = (fVar203 * fVar203 + fVar215 * fVar215 + fStack_4f0 * fStack_4f0) -
              fStack_1b0 * fStack_1b0;
    fVar292 = (fVar204 * fVar204 + fVar216 * fVar216 + fStack_4ec * fStack_4ec) -
              fStack_1ac * fStack_1ac;
    fVar239 = (auVar285._0_4_ + auVar86._0_4_) * 1.0000002;
    fVar246 = (auVar285._4_4_ + auVar86._4_4_) * 1.0000002;
    fVar247 = (auVar285._8_4_ + auVar86._8_4_) * 1.0000002;
    fVar257 = (auVar285._12_4_ + auVar86._12_4_) * 1.0000002;
    fVar265 = fVar277 - fVar239 * fVar239;
    fVar160 = fVar177 - fVar246 * fVar246;
    fVar267 = fVar279 - fVar247 * fVar247;
    fVar276 = fVar292 - fVar257 * fVar257;
    local_1a8 = local_198 * local_198;
    fStack_1a4 = fStack_194 * fStack_194;
    fStack_1a0 = fStack_190 * fStack_190;
    fStack_19c = fStack_18c * fStack_18c;
    fVar239 = local_148 - local_1a8;
    fVar246 = fStack_144 - fStack_1a4;
    fVar247 = fStack_140 - fStack_1a0;
    fVar257 = fStack_13c - fStack_19c;
    local_1c8 = local_1c8 + local_1c8;
    fStack_1c4 = fStack_1c4 + fStack_1c4;
    fStack_1c0 = fStack_1c0 + fStack_1c0;
    fStack_1bc = fStack_1bc + fStack_1bc;
    local_578._0_4_ = fVar239 * 4.0;
    local_578._4_4_ = fVar246 * 4.0;
    fStack_570 = fVar247 * 4.0;
    fStack_56c = fVar257 * 4.0;
    auVar286._0_4_ = local_1c8 * local_1c8 - (float)local_578._0_4_ * fVar265;
    auVar286._4_4_ = fStack_1c4 * fStack_1c4 - (float)local_578._4_4_ * fVar160;
    auVar286._8_4_ = fStack_1c0 * fStack_1c0 - fStack_570 * fVar267;
    auVar286._12_4_ = fStack_1bc * fStack_1bc - fStack_56c * fVar276;
    auVar165._0_4_ = (auVar272._0_4_ - auVar86._0_4_) * 0.99999976;
    auVar165._4_4_ = (auVar272._4_4_ - auVar86._4_4_) * 0.99999976;
    auVar165._8_4_ = (auVar272._8_4_ - auVar86._8_4_) * 0.99999976;
    auVar165._12_4_ = (auVar272._12_4_ - auVar86._12_4_) * 0.99999976;
    auVar207._4_4_ = -(uint)(0.0 <= auVar286._4_4_);
    auVar207._0_4_ = -(uint)(0.0 <= auVar286._0_4_);
    auVar207._8_4_ = -(uint)(0.0 <= auVar286._8_4_);
    auVar207._12_4_ = -(uint)(0.0 <= auVar286._12_4_);
    uVar70 = (undefined4)((ulong)lVar65 >> 0x20);
    iVar62 = movmskps((int)lVar65,auVar207);
    if (iVar62 == 0) {
      iVar62 = 0;
      auVar166 = _DAT_01f7aa00;
      auVar261 = _DAT_01f7a9f0;
    }
    else {
      auVar163 = sqrtps(auVar327,auVar286);
      bVar78 = 0.0 <= auVar286._0_4_;
      uVar79 = -(uint)bVar78;
      bVar23 = 0.0 <= auVar286._4_4_;
      uVar80 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar286._8_4_;
      uVar81 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar286._12_4_;
      uVar82 = -(uint)bVar25;
      auVar186._0_4_ = fVar239 + fVar239;
      auVar186._4_4_ = fVar246 + fVar246;
      auVar186._8_4_ = fVar247 + fVar247;
      auVar186._12_4_ = fVar257 + fVar257;
      auVar86 = rcpps(auVar165,auVar186);
      fVar310 = auVar86._0_4_;
      fVar312 = auVar86._4_4_;
      fVar319 = auVar86._8_4_;
      fVar321 = auVar86._12_4_;
      fVar310 = (1.0 - auVar186._0_4_ * fVar310) * fVar310 + fVar310;
      fVar312 = (1.0 - auVar186._4_4_ * fVar312) * fVar312 + fVar312;
      fVar319 = (1.0 - auVar186._8_4_ * fVar319) * fVar319 + fVar319;
      fVar321 = (1.0 - auVar186._12_4_ * fVar321) * fVar321 + fVar321;
      fVar323 = (-local_1c8 - auVar163._0_4_) * fVar310;
      fVar332 = (-fStack_1c4 - auVar163._4_4_) * fVar312;
      fVar293 = (-fStack_1c0 - auVar163._8_4_) * fVar319;
      fVar295 = (-fStack_1bc - auVar163._12_4_) * fVar321;
      fVar310 = (auVar163._0_4_ - local_1c8) * fVar310;
      fVar312 = (auVar163._4_4_ - fStack_1c4) * fVar312;
      fVar319 = (auVar163._8_4_ - fStack_1c0) * fVar319;
      fVar321 = (auVar163._12_4_ - fStack_1bc) * fVar321;
      local_208 = (local_198 * fVar323 + local_1b8) * fVar237;
      fStack_204 = (fStack_194 * fVar332 + fStack_1b4) * fVar238;
      fStack_200 = (fStack_190 * fVar293 + fStack_1b0) * auVar327._8_4_;
      fStack_1fc = (fStack_18c * fVar295 + fStack_1ac) * auVar327._12_4_;
      local_538._4_4_ = (fStack_194 * fVar312 + fStack_1b4) * fVar238;
      local_538._0_4_ = (local_198 * fVar310 + local_1b8) * fVar237;
      fStack_530 = (fStack_190 * fVar319 + fStack_1b0) * auVar327._8_4_;
      fStack_52c = (fStack_18c * fVar321 + fStack_1ac) * auVar327._12_4_;
      auVar187._0_4_ = (uint)fVar323 & uVar79;
      auVar187._4_4_ = (uint)fVar332 & uVar80;
      auVar187._8_4_ = (uint)fVar293 & uVar81;
      auVar187._12_4_ = (uint)fVar295 & uVar82;
      auVar261._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
      auVar261._8_4_ = ~uVar81 & 0x7f800000;
      auVar261._12_4_ = ~uVar82 & 0x7f800000;
      auVar261 = auVar261 | auVar187;
      auVar328._0_4_ = (uint)fVar310 & uVar79;
      auVar328._4_4_ = (uint)fVar312 & uVar80;
      auVar328._8_4_ = (uint)fVar319 & uVar81;
      auVar328._12_4_ = (uint)fVar321 & uVar82;
      auVar166._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
      auVar166._8_4_ = ~uVar81 & 0xff800000;
      auVar166._12_4_ = ~uVar82 & 0xff800000;
      auVar166 = auVar166 | auVar328;
      auVar304._0_8_ = CONCAT44(fStack_1a4,local_1a8) & 0x7fffffff7fffffff;
      auVar304._8_4_ = ABS(fStack_1a0);
      auVar304._12_4_ = ABS(fStack_19c);
      auVar36._4_4_ = fStack_3a4;
      auVar36._0_4_ = local_3a8;
      auVar36._8_4_ = fStack_3a0;
      auVar36._12_4_ = fStack_39c;
      auVar86 = maxps(auVar36,auVar304);
      fVar310 = auVar86._0_4_ * 1.9073486e-06;
      fVar312 = auVar86._4_4_ * 1.9073486e-06;
      fVar319 = auVar86._8_4_ * 1.9073486e-06;
      fVar321 = auVar86._12_4_ * 1.9073486e-06;
      auVar329._0_4_ = -(uint)(ABS(fVar239) < fVar310 && bVar78);
      auVar329._4_4_ = -(uint)(ABS(fVar246) < fVar312 && bVar23);
      auVar329._8_4_ = -(uint)(ABS(fVar247) < fVar319 && bVar24);
      auVar329._12_4_ = -(uint)(ABS(fVar257) < fVar321 && bVar25);
      iVar62 = movmskps(iVar62,auVar329);
      if (iVar62 != 0) {
        uVar79 = -(uint)(fVar265 <= 0.0);
        uVar80 = -(uint)(fVar160 <= 0.0);
        uVar81 = -(uint)(fVar267 <= 0.0);
        uVar82 = -(uint)(fVar276 <= 0.0);
        auVar273._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar329._0_4_;
        auVar273._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar329._4_4_;
        auVar273._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar329._8_4_;
        auVar273._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar329._12_4_;
        auVar305._0_4_ = ~auVar329._0_4_ & auVar261._0_4_;
        auVar305._4_4_ = ~auVar329._4_4_ & auVar261._4_4_;
        auVar305._8_4_ = ~auVar329._8_4_ & auVar261._8_4_;
        auVar305._12_4_ = ~auVar329._12_4_ & auVar261._12_4_;
        auVar262._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar329._0_4_;
        auVar262._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar329._4_4_;
        auVar262._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar329._8_4_;
        auVar262._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar329._12_4_;
        auVar330._0_4_ = ~auVar329._0_4_ & auVar166._0_4_;
        auVar330._4_4_ = ~auVar329._4_4_ & auVar166._4_4_;
        auVar330._8_4_ = ~auVar329._8_4_ & auVar166._8_4_;
        auVar330._12_4_ = ~auVar329._12_4_ & auVar166._12_4_;
        auVar207._4_4_ = -(uint)((fVar312 <= ABS(fVar246) || fVar160 <= 0.0) && bVar23);
        auVar207._0_4_ = -(uint)((fVar310 <= ABS(fVar239) || fVar265 <= 0.0) && bVar78);
        auVar207._8_4_ = -(uint)((fVar319 <= ABS(fVar247) || fVar267 <= 0.0) && bVar24);
        auVar207._12_4_ = -(uint)((fVar321 <= ABS(fVar257) || fVar276 <= 0.0) && bVar25);
        auVar166 = auVar330 | auVar262;
        auVar261 = auVar305 | auVar273;
      }
    }
    auVar27._4_4_ = fVar84;
    auVar27._0_4_ = fVar84;
    auVar27._8_4_ = fVar84;
    auVar27._12_4_ = fVar84;
    auVar208._0_4_ = (auVar207._0_4_ << 0x1f) >> 0x1f;
    auVar208._4_4_ = (auVar207._4_4_ << 0x1f) >> 0x1f;
    auVar208._8_4_ = (auVar207._8_4_ << 0x1f) >> 0x1f;
    auVar208._12_4_ = (auVar207._12_4_ << 0x1f) >> 0x1f;
    auVar208 = auVar208 & local_1f8;
    iVar62 = movmskps(iVar62,auVar208);
    if (iVar62 != 0) {
      local_218 = auVar334;
      local_3b8 = fVar239;
      fStack_3b4 = fVar246;
      fStack_3b0 = fVar247;
      fStack_3ac = fVar257;
      fVar265 = *(float *)(ray + k * 4 + 0x80);
      auVar241._0_4_ = fVar265 - (float)local_418._0_4_;
      auVar241._4_4_ = auVar241._0_4_;
      auVar241._8_4_ = auVar241._0_4_;
      auVar241._12_4_ = auVar241._0_4_;
      auVar163 = minps(auVar241,auVar166);
      auVar39._4_4_ = fStack_1e4;
      auVar39._0_4_ = local_1e8;
      auVar39._8_4_ = fStack_1e0;
      auVar39._12_4_ = fStack_1dc;
      auVar272 = maxps(auVar39,auVar261);
      auVar167._0_4_ = fVar325 * fVar85 + fVar331 * fVar84 + local_4c8 * local_528;
      auVar167._4_4_ = (float)local_508._0_4_ * fVar85 + fVar278 * fVar84 + fStack_4c4 * fStack_524;
      auVar167._8_4_ =
           (float)local_508._4_4_ * fVar85 +
           (float)local_4b8._8_4_ * fVar84 + fStack_4c0 * fStack_520;
      auVar167._12_4_ =
           fStack_500 * fVar85 + (float)local_4b8._12_4_ * fVar84 + fStack_4bc * fStack_51c;
      auVar86 = rcpps(auVar27,auVar167);
      fVar160 = auVar86._0_4_;
      fVar267 = auVar86._4_4_;
      fVar276 = auVar86._8_4_;
      fVar310 = auVar86._12_4_;
      fVar161 = ((1.0 - auVar167._0_4_ * fVar160) * fVar160 + fVar160) *
                -(fVar161 * fVar325 + fVar205 * fVar331 + local_4f8 * local_4c8);
      fVar175 = ((1.0 - auVar167._4_4_ * fVar267) * fVar267 + fVar267) *
                -(fVar175 * (float)local_508._0_4_ + fVar214 * fVar278 + fStack_4f4 * fStack_4c4);
      fVar203 = ((1.0 - auVar167._8_4_ * fVar276) * fVar276 + fVar276) *
                -(fVar203 * (float)local_508._4_4_ +
                 fVar215 * (float)local_4b8._8_4_ + fStack_4f0 * fStack_4c0);
      fVar204 = ((1.0 - auVar167._12_4_ * fVar310) * fVar310 + fVar310) *
                -(fVar204 * fStack_500 + fVar216 * (float)local_4b8._12_4_ + fStack_4ec * fStack_4bc
                 );
      uVar79 = -(uint)(auVar167._0_4_ < 0.0 || ABS(auVar167._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar167._4_4_ < 0.0 || ABS(auVar167._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar167._8_4_ < 0.0 || ABS(auVar167._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar167._12_4_ < 0.0 || ABS(auVar167._12_4_) < 1e-18);
      auVar188._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar188._8_4_ = uVar81 & 0xff800000;
      auVar188._12_4_ = uVar82 & 0xff800000;
      auVar107._0_4_ = ~uVar79 & (uint)fVar161;
      auVar107._4_4_ = ~uVar80 & (uint)fVar175;
      auVar107._8_4_ = ~uVar81 & (uint)fVar203;
      auVar107._12_4_ = ~uVar82 & (uint)fVar204;
      auVar272 = maxps(auVar272,auVar107 | auVar188);
      uVar79 = -(uint)(0.0 < auVar167._0_4_ || ABS(auVar167._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar167._4_4_ || ABS(auVar167._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar167._8_4_ || ABS(auVar167._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar167._12_4_ || ABS(auVar167._12_4_) < 1e-18);
      auVar108._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar108._8_4_ = uVar81 & 0x7f800000;
      auVar108._12_4_ = uVar82 & 0x7f800000;
      auVar168._0_4_ = ~uVar79 & (uint)fVar161;
      auVar168._4_4_ = ~uVar80 & (uint)fVar175;
      auVar168._8_4_ = ~uVar81 & (uint)fVar203;
      auVar168._12_4_ = ~uVar82 & (uint)fVar204;
      auVar163 = minps(auVar163,auVar168 | auVar108);
      auVar189._0_4_ = (0.0 - fVar335) * -fVar278 + (0.0 - fVar256) * -fStack_4c4;
      auVar189._4_4_ = (0.0 - fVar336) * -(float)local_4b8._8_4_ + (0.0 - fVar258) * -fStack_4c0;
      auVar189._8_4_ = (0.0 - fVar337) * -(float)local_4b8._12_4_ + (0.0 - fVar266) * -fStack_4bc;
      auVar189._12_4_ = 0x80000000;
      auVar142._0_4_ =
           -(float)local_508._0_4_ * fVar85 + -fVar278 * fVar84 + -fStack_4c4 * local_528;
      auVar142._4_4_ =
           -(float)local_508._4_4_ * fVar85 +
           -(float)local_4b8._8_4_ * fVar84 + -fStack_4c0 * fStack_524;
      auVar142._8_4_ =
           -fStack_500 * fVar85 + -(float)local_4b8._12_4_ * fVar84 + -fStack_4bc * fStack_520;
      auVar142._12_4_ = fVar85 * -0.0 + fVar84 * -0.0 + fStack_51c * -0.0;
      auVar86 = rcpps(auVar189,auVar142);
      fVar161 = auVar86._0_4_;
      fVar175 = auVar86._4_4_;
      fVar203 = auVar86._8_4_;
      fVar204 = auVar86._12_4_;
      fVar161 = (((float)DAT_01f7ba10 - auVar142._0_4_ * fVar161) * fVar161 + fVar161) *
                -((0.0 - fVar297) * -(float)local_508._0_4_ + auVar189._0_4_);
      fVar175 = ((DAT_01f7ba10._4_4_ - auVar142._4_4_ * fVar175) * fVar175 + fVar175) *
                -((0.0 - fVar306) * -(float)local_508._4_4_ + auVar189._4_4_);
      fVar203 = ((DAT_01f7ba10._8_4_ - auVar142._8_4_ * fVar203) * fVar203 + fVar203) *
                -((0.0 - fVar308) * -fStack_500 + auVar189._8_4_);
      fVar204 = ((DAT_01f7ba10._12_4_ - auVar142._12_4_ * fVar204) * fVar204 + fVar204) * 0.0;
      uVar79 = -(uint)(auVar142._0_4_ < 0.0 || ABS(auVar142._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar142._4_4_ < 0.0 || ABS(auVar142._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar142._8_4_ < 0.0 || ABS(auVar142._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar142._12_4_ < 0.0 || ABS(auVar142._12_4_) < 1e-18);
      auVar287._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar287._8_4_ = uVar81 & 0xff800000;
      auVar287._12_4_ = uVar82 & 0xff800000;
      auVar109._0_4_ = ~uVar79 & (uint)fVar161;
      auVar109._4_4_ = ~uVar80 & (uint)fVar175;
      auVar109._8_4_ = ~uVar81 & (uint)fVar203;
      auVar109._12_4_ = ~uVar82 & (uint)fVar204;
      auVar272 = maxps(auVar272,auVar109 | auVar287);
      uVar79 = -(uint)(0.0 < auVar142._0_4_ || ABS(auVar142._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar142._4_4_ || ABS(auVar142._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar142._8_4_ || ABS(auVar142._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar142._12_4_ || ABS(auVar142._12_4_) < 1e-18);
      auVar110._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar110._8_4_ = uVar81 & 0x7f800000;
      auVar110._12_4_ = uVar82 & 0x7f800000;
      auVar143._0_4_ = ~uVar79 & (uint)fVar161;
      auVar143._4_4_ = ~uVar80 & (uint)fVar175;
      auVar143._8_4_ = ~uVar81 & (uint)fVar203;
      auVar143._12_4_ = ~uVar82 & (uint)fVar204;
      auVar86 = minps(auVar163,auVar143 | auVar110);
      fVar204 = auVar272._12_4_;
      fVar161 = auVar272._0_4_;
      fVar175 = auVar272._4_4_;
      fVar203 = auVar272._8_4_;
      auVar144._0_4_ = -(uint)(fVar161 <= auVar86._0_4_) & auVar208._0_4_;
      auVar144._4_4_ = -(uint)(fVar175 <= auVar86._4_4_) & auVar208._4_4_;
      auVar144._8_4_ = -(uint)(fVar203 <= auVar86._8_4_) & auVar208._8_4_;
      auVar144._12_4_ = -(uint)(fVar204 <= auVar86._12_4_) & auVar208._12_4_;
      iVar62 = movmskps(iVar62,auVar144);
      if (iVar62 != 0) {
        auVar163 = maxps(ZEXT816(0),auVar165);
        auVar38._4_4_ = fStack_204;
        auVar38._0_4_ = local_208;
        auVar38._8_4_ = fStack_200;
        auVar38._12_4_ = fStack_1fc;
        auVar260 = minps(auVar38,_DAT_01f7ba10);
        auVar209._0_12_ = ZEXT812(0);
        auVar209._12_4_ = 0.0;
        auVar285 = maxps(auVar260,auVar209);
        auVar260 = minps(_local_538,_DAT_01f7ba10);
        auVar260 = maxps(auVar260,auVar209);
        local_108[0] = (auVar285._0_4_ + 0.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_108[1] = (auVar285._4_4_ + 1.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_108[2] = (auVar285._8_4_ + 2.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_108[3] = (auVar285._12_4_ + 3.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_118[0] = (auVar260._0_4_ + 0.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_118[1] = (auVar260._4_4_ + 1.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_118[2] = (auVar260._8_4_ + 2.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        local_118[3] = (auVar260._12_4_ + 3.0) * 0.25 * (float)local_678._4_4_ + local_1d8;
        auVar169._0_4_ = fVar277 - auVar163._0_4_ * auVar163._0_4_;
        auVar169._4_4_ = fVar177 - auVar163._4_4_ * auVar163._4_4_;
        auVar169._8_4_ = fVar279 - auVar163._8_4_ * auVar163._8_4_;
        auVar169._12_4_ = fVar292 - auVar163._12_4_ * auVar163._12_4_;
        auVar263._0_4_ = local_1c8 * local_1c8 - (float)local_578._0_4_ * auVar169._0_4_;
        auVar263._4_4_ = fStack_1c4 * fStack_1c4 - (float)local_578._4_4_ * auVar169._4_4_;
        auVar263._8_4_ = fStack_1c0 * fStack_1c0 - fStack_570 * auVar169._8_4_;
        auVar263._12_4_ = fStack_1bc * fStack_1bc - fStack_56c * auVar169._12_4_;
        local_538._4_4_ = -(uint)(0.0 <= auVar263._4_4_);
        local_538._0_4_ = -(uint)(0.0 <= auVar263._0_4_);
        fStack_530 = (float)-(uint)(0.0 <= auVar263._8_4_);
        fStack_52c = (float)-(uint)(0.0 <= auVar263._12_4_);
        iVar62 = movmskps(iVar62,_local_538);
        if (iVar62 == 0) {
          _local_5e8 = ZEXT816(0);
          fVar160 = 0.0;
          fVar267 = 0.0;
          fVar276 = 0.0;
          fVar277 = 0.0;
          _local_5b8 = ZEXT816(0);
          fVar205 = 0.0;
          fVar214 = 0.0;
          fVar215 = 0.0;
          fVar216 = 0.0;
          _local_578 = ZEXT816(0);
          iVar62 = 0;
          auVar243 = _DAT_01f7aa00;
          auVar255 = _DAT_01f7a9f0;
        }
        else {
          auVar260 = sqrtps(_local_678,auVar263);
          auVar111._0_4_ = fVar239 + fVar239;
          auVar111._4_4_ = fVar246 + fVar246;
          auVar111._8_4_ = fVar247 + fVar247;
          auVar111._12_4_ = fVar257 + fVar257;
          auVar163 = rcpps(auVar169,auVar111);
          fVar177 = auVar163._0_4_;
          fVar279 = auVar163._4_4_;
          fVar292 = auVar163._8_4_;
          fVar312 = auVar163._12_4_;
          fVar177 = ((float)DAT_01f7ba10 - auVar111._0_4_ * fVar177) * fVar177 + fVar177;
          fVar279 = (DAT_01f7ba10._4_4_ - auVar111._4_4_ * fVar279) * fVar279 + fVar279;
          fVar292 = (DAT_01f7ba10._8_4_ - auVar111._8_4_ * fVar292) * fVar292 + fVar292;
          fVar312 = (DAT_01f7ba10._12_4_ - auVar111._12_4_ * fVar312) * fVar312 + fVar312;
          fVar321 = (-local_1c8 - auVar260._0_4_) * fVar177;
          fVar323 = (-fStack_1c4 - auVar260._4_4_) * fVar279;
          fVar325 = (-fStack_1c0 - auVar260._8_4_) * fVar292;
          fVar331 = (-fStack_1bc - auVar260._12_4_) * fVar312;
          fVar177 = (auVar260._0_4_ - local_1c8) * fVar177;
          fVar279 = (auVar260._4_4_ - fStack_1c4) * fVar279;
          fVar292 = (auVar260._8_4_ - fStack_1c0) * fVar292;
          fVar312 = (auVar260._12_4_ - fStack_1bc) * fVar312;
          fVar160 = (local_198 * fVar321 + local_1b8) * fVar237;
          fVar267 = (fStack_194 * fVar323 + fStack_1b4) * fVar238;
          fVar276 = (fStack_190 * fVar325 + fStack_1b0) * auVar327._8_4_;
          fVar277 = (fStack_18c * fVar331 + fStack_1ac) * auVar327._12_4_;
          local_5b8._4_4_ = fVar85 * fVar323 - (fStack_444 * fVar267 + fVar297);
          local_5b8._0_4_ = fVar85 * fVar321 - (local_448 * fVar160 + fVar294);
          fStack_5b0 = fVar85 * fVar325 - (fStack_440 * fVar276 + fVar306);
          fStack_5ac = fVar85 * fVar331 - (fStack_43c * fVar277 + fVar308);
          fVar205 = fVar84 * fVar321 - ((float)local_428._0_4_ * fVar160 + fVar333);
          fVar214 = fVar84 * fVar323 - ((float)local_428._4_4_ * fVar267 + fVar335);
          fVar215 = fVar84 * fVar325 - (fStack_420 * fVar276 + fVar336);
          fVar216 = fVar84 * fVar331 - (fStack_41c * fVar277 + fVar337);
          local_578._4_4_ = fStack_524 * fVar323 - (fVar267 * (float)local_438._4_4_ + fVar256);
          local_578._0_4_ = local_528 * fVar321 - (fVar160 * (float)local_438._0_4_ + fVar248);
          fStack_570 = fStack_520 * fVar325 - (fVar276 * fStack_430 + fVar258);
          fStack_56c = fStack_51c * fVar331 - (fVar277 * fStack_42c + fVar266);
          fVar237 = (local_198 * fVar177 + local_1b8) * fVar237;
          fVar238 = (fStack_194 * fVar279 + fStack_1b4) * fVar238;
          fVar310 = (fStack_190 * fVar292 + fStack_1b0) * auVar327._8_4_;
          fVar319 = (fStack_18c * fVar312 + fStack_1ac) * auVar327._12_4_;
          local_5e8._4_4_ = fVar85 * fVar279 - (fStack_444 * fVar238 + fVar297);
          local_5e8._0_4_ = fVar85 * fVar177 - (local_448 * fVar237 + fVar294);
          fStack_5e0 = fVar85 * fVar292 - (fStack_440 * fVar310 + fVar306);
          fStack_5dc = fVar85 * fVar312 - (fStack_43c * fVar319 + fVar308);
          fVar160 = fVar84 * fVar177 - ((float)local_428._0_4_ * fVar237 + fVar333);
          fVar267 = fVar84 * fVar279 - ((float)local_428._4_4_ * fVar238 + fVar335);
          fVar276 = fVar84 * fVar292 - (fStack_420 * fVar310 + fVar336);
          fVar277 = fVar84 * fVar312 - (fStack_41c * fVar319 + fVar337);
          bVar78 = 0.0 <= auVar263._0_4_;
          uVar79 = -(uint)bVar78;
          bVar23 = 0.0 <= auVar263._4_4_;
          uVar80 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar263._8_4_;
          uVar81 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar263._12_4_;
          uVar82 = -(uint)bVar25;
          auVar209._0_4_ = local_528 * fVar177 - (fVar237 * (float)local_438._0_4_ + fVar248);
          auVar209._4_4_ = fStack_524 * fVar279 - (fVar238 * (float)local_438._4_4_ + fVar256);
          auVar209._8_4_ = fStack_520 * fVar292 - (fVar310 * fStack_430 + fVar258);
          auVar209._12_4_ = fStack_51c * fVar312 - (fVar319 * fStack_42c + fVar266);
          auVar242._0_4_ = (uint)fVar321 & uVar79;
          auVar242._4_4_ = (uint)fVar323 & uVar80;
          auVar242._8_4_ = (uint)fVar325 & uVar81;
          auVar242._12_4_ = (uint)fVar331 & uVar82;
          auVar255._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
          auVar255._8_4_ = ~uVar81 & 0x7f800000;
          auVar255._12_4_ = ~uVar82 & 0x7f800000;
          auVar255 = auVar255 | auVar242;
          auVar234._0_4_ = (uint)fVar177 & uVar79;
          auVar234._4_4_ = (uint)fVar279 & uVar80;
          auVar234._8_4_ = (uint)fVar292 & uVar81;
          auVar234._12_4_ = (uint)fVar312 & uVar82;
          auVar243._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
          auVar243._8_4_ = ~uVar81 & 0xff800000;
          auVar243._12_4_ = ~uVar82 & 0xff800000;
          auVar243 = auVar243 | auVar234;
          auVar170._0_8_ = CONCAT44(fStack_1a4,local_1a8) & 0x7fffffff7fffffff;
          auVar170._8_4_ = ABS(fStack_1a0);
          auVar170._12_4_ = ABS(fStack_19c);
          auVar37._4_4_ = fStack_3a4;
          auVar37._0_4_ = local_3a8;
          auVar37._8_4_ = fStack_3a0;
          auVar37._12_4_ = fStack_39c;
          auVar163 = maxps(auVar37,auVar170);
          fVar237 = auVar163._0_4_ * 1.9073486e-06;
          fVar238 = auVar163._4_4_ * 1.9073486e-06;
          fVar248 = auVar163._8_4_ * 1.9073486e-06;
          fVar256 = auVar163._12_4_ * 1.9073486e-06;
          auVar235._0_4_ = -(uint)(ABS(fVar239) < fVar237 && bVar78);
          auVar235._4_4_ = -(uint)(ABS(fVar246) < fVar238 && bVar23);
          auVar235._8_4_ = -(uint)(ABS(fVar247) < fVar248 && bVar24);
          auVar235._12_4_ = -(uint)(ABS(fVar257) < fVar256 && bVar25);
          iVar62 = movmskps(iVar62,auVar235);
          if (iVar62 != 0) {
            uVar79 = -(uint)(auVar169._0_4_ <= 0.0);
            uVar80 = -(uint)(auVar169._4_4_ <= 0.0);
            uVar81 = -(uint)(auVar169._8_4_ <= 0.0);
            uVar82 = -(uint)(auVar169._12_4_ <= 0.0);
            auVar290._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar235._0_4_;
            auVar290._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar235._4_4_;
            auVar290._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar235._8_4_;
            auVar290._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar235._12_4_;
            auVar264._0_4_ = ~auVar235._0_4_ & auVar255._0_4_;
            auVar264._4_4_ = ~auVar235._4_4_ & auVar255._4_4_;
            auVar264._8_4_ = ~auVar235._8_4_ & auVar255._8_4_;
            auVar264._12_4_ = ~auVar235._12_4_ & auVar255._12_4_;
            auVar255 = auVar264 | auVar290;
            auVar291._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar235._0_4_;
            auVar291._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar235._4_4_;
            auVar291._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar235._8_4_;
            auVar291._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar235._12_4_;
            auVar236._0_4_ = ~auVar235._0_4_ & auVar243._0_4_;
            auVar236._4_4_ = ~auVar235._4_4_ & auVar243._4_4_;
            auVar236._8_4_ = ~auVar235._8_4_ & auVar243._8_4_;
            auVar236._12_4_ = ~auVar235._12_4_ & auVar243._12_4_;
            auVar243 = auVar236 | auVar291;
            local_538._4_4_ = -(uint)((fVar238 <= ABS(fVar246) || auVar169._4_4_ <= 0.0) && bVar23);
            local_538._0_4_ = -(uint)((fVar237 <= ABS(fVar239) || auVar169._0_4_ <= 0.0) && bVar78);
            fStack_530 = (float)-(uint)((fVar248 <= ABS(fVar247) || auVar169._8_4_ <= 0.0) && bVar24
                                       );
            fStack_52c = (float)-(uint)((fVar256 <= ABS(fVar257) || auVar169._12_4_ <= 0.0) &&
                                       bVar25);
          }
        }
        fVar237 = auVar209._0_4_ * local_528;
        fVar238 = auVar209._4_4_ * fStack_524;
        fVar239 = auVar209._8_4_ * fStack_520;
        fVar246 = auVar209._12_4_ * fStack_51c;
        _local_138 = auVar272;
        local_128 = minps(auVar86,auVar255);
        _local_248 = maxps(auVar272,auVar243);
        local_238 = auVar86;
        auVar190._0_4_ = -(uint)(fVar161 <= local_128._0_4_) & auVar144._0_4_;
        auVar190._4_4_ = -(uint)(fVar175 <= local_128._4_4_) & auVar144._4_4_;
        auVar190._8_4_ = -(uint)(fVar203 <= local_128._8_4_) & auVar144._8_4_;
        auVar190._12_4_ = -(uint)(fVar204 <= local_128._12_4_) & auVar144._12_4_;
        fVar247 = local_248._0_4_;
        fVar248 = local_248._4_4_;
        fVar256 = local_248._8_4_;
        fVar257 = local_248._12_4_;
        local_428 = (undefined1  [8])
                    CONCAT44(-(uint)(fVar248 <= auVar86._4_4_) & auVar144._4_4_,
                             -(uint)(fVar247 <= auVar86._0_4_) & auVar144._0_4_);
        fStack_420 = (float)(-(uint)(fVar256 <= auVar86._8_4_) & auVar144._8_4_);
        fStack_41c = (float)(-(uint)(fVar257 <= auVar86._12_4_) & auVar144._12_4_);
        auVar145._8_4_ = fStack_420;
        auVar145._0_8_ = local_428;
        auVar145._12_4_ = fStack_41c;
        iVar62 = movmskps(iVar62,auVar145 | auVar190);
        if (iVar62 != 0) {
          local_448 = fVar127;
          fStack_444 = fVar127;
          fStack_440 = fVar127;
          fStack_43c = fVar127;
          local_578._0_4_ =
               -(uint)((int)fVar127 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._0_4_ * local_528 +
                                                 fVar205 * fVar84 + (float)local_5b8._0_4_ * fVar85)
                                     ) & local_538._0_4_) << 0x1f) >> 0x1f) + 4);
          local_578._4_4_ =
               -(uint)((int)fVar127 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._4_4_ * fStack_524 +
                                                 fVar214 * fVar84 + (float)local_5b8._4_4_ * fVar85)
                                     ) & local_538._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_570 = (float)-(uint)((int)fVar127 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_570 * fStack_520 +
                                                                fVar215 * fVar84 +
                                                                fStack_5b0 * fVar85)) &
                                            (uint)fStack_530) << 0x1f) >> 0x1f) + 4);
          fStack_56c = (float)-(uint)((int)fVar127 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_56c * fStack_51c +
                                                                fVar216 * fVar84 +
                                                                fStack_5ac * fVar85)) &
                                            (uint)fStack_52c) << 0x1f) >> 0x1f) + 4);
          local_3f8 = ~_local_578 & auVar190;
          iVar62 = movmskps(iVar62,local_3f8);
          _local_438 = auVar190;
          fVar205 = fVar247;
          fVar214 = fVar248;
          fVar215 = fVar256;
          fVar216 = fVar257;
          if (iVar62 != 0) {
            local_518 = fVar178 + fVar161;
            fStack_514 = fVar178 + fVar175;
            fStack_510 = fVar178 + fVar203;
            fStack_50c = fVar178 + fVar204;
            do {
              auVar163 = ~local_3f8 & _DAT_01f7a9f0 | local_3f8 & auVar272;
              auVar191._4_4_ = auVar163._0_4_;
              auVar191._0_4_ = auVar163._4_4_;
              auVar191._8_4_ = auVar163._12_4_;
              auVar191._12_4_ = auVar163._8_4_;
              auVar86 = minps(auVar191,auVar163);
              auVar146._0_8_ = auVar86._8_8_;
              auVar146._8_4_ = auVar86._0_4_;
              auVar146._12_4_ = auVar86._4_4_;
              auVar86 = minps(auVar146,auVar86);
              auVar147._0_8_ =
                   CONCAT44(-(uint)(auVar86._4_4_ == auVar163._4_4_) & local_3f8._4_4_,
                            -(uint)(auVar86._0_4_ == auVar163._0_4_) & local_3f8._0_4_);
              auVar147._8_4_ = -(uint)(auVar86._8_4_ == auVar163._8_4_) & local_3f8._8_4_;
              auVar147._12_4_ = -(uint)(auVar86._12_4_ == auVar163._12_4_) & local_3f8._12_4_;
              iVar62 = movmskps(iVar62,auVar147);
              auVar112 = local_3f8;
              if (iVar62 != 0) {
                auVar112._8_4_ = auVar147._8_4_;
                auVar112._0_8_ = auVar147._0_8_;
                auVar112._12_4_ = auVar147._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar112);
              lVar22 = 0;
              if (CONCAT44(uVar70,uVar63) != 0) {
                for (; (CONCAT44(uVar70,uVar63) >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              *(undefined4 *)(local_3f8 + lVar22 * 4) = 0;
              auVar32._4_4_ = fStack_464;
              auVar32._0_4_ = local_468;
              auVar32._8_4_ = fStack_460;
              auVar32._12_4_ = fStack_45c;
              auVar30._4_4_ = fStack_474;
              auVar30._0_4_ = local_478;
              auVar30._8_4_ = fStack_470;
              auVar30._12_4_ = fStack_46c;
              auVar163 = minps(auVar32,auVar30);
              auVar260 = maxps(auVar32,auVar30);
              auVar28._4_4_ = fStack_484;
              auVar28._0_4_ = local_488;
              auVar28._8_4_ = fStack_480;
              auVar28._12_4_ = fStack_47c;
              auVar34._4_4_ = fStack_454;
              auVar34._0_4_ = local_458;
              auVar34._8_4_ = fStack_450;
              auVar34._12_4_ = fStack_44c;
              auVar86 = minps(auVar28,auVar34);
              auVar163 = minps(auVar163,auVar86);
              auVar86 = maxps(auVar28,auVar34);
              auVar260 = maxps(auVar260,auVar86);
              auVar192._0_8_ = auVar163._0_8_ & 0x7fffffff7fffffff;
              auVar192._8_4_ = auVar163._8_4_ & 0x7fffffff;
              auVar192._12_4_ = auVar163._12_4_ & 0x7fffffff;
              auVar113._0_8_ = auVar260._0_8_ & 0x7fffffff7fffffff;
              auVar113._8_4_ = auVar260._8_4_ & 0x7fffffff;
              auVar113._12_4_ = ABS(auVar260._12_4_);
              auVar86 = maxps(auVar192,auVar113);
              fVar161 = auVar86._4_4_;
              if (auVar86._4_4_ <= auVar86._0_4_) {
                fVar161 = auVar86._0_4_;
              }
              auVar193._8_8_ = auVar86._8_8_;
              auVar193._0_8_ = auVar86._8_8_;
              if (auVar86._8_4_ <= fVar161) {
                auVar193._0_4_ = fVar161;
              }
              register0x000012c4 = auVar193._4_12_;
              local_4a8._0_4_ = auVar193._0_4_ * 1.9073486e-06;
              fVar161 = local_108[lVar22];
              fVar175 = *(float *)(local_138 + lVar22 * 4);
              bVar78 = true;
              uVar75 = 0;
              do {
                fVar205 = SQRT(fVar128) * 1.9073486e-06 * fVar175;
                fVar306 = 1.0 - fVar161;
                fVar203 = fVar306 * fVar306 * fVar306;
                fVar216 = fVar161 * fVar161 * fVar161;
                fVar215 = fVar161 * fVar306;
                fVar204 = fVar203 * 0.16666667;
                fVar266 = (fVar306 * fVar215 * 12.0 + fVar161 * fVar215 * 6.0 +
                          fVar203 * 4.0 + fVar216) * 0.16666667;
                fVar177 = (fVar161 * fVar215 * 12.0 + fVar306 * fVar215 * 6.0 +
                          fVar216 * 4.0 + fVar203) * 0.16666667;
                fVar216 = fVar216 * 0.16666667;
                fVar214 = fVar204 * fStack_45c +
                          fVar266 * fStack_46c + fVar177 * fStack_47c + fVar216 * fStack_44c;
                fVar265 = -fVar306 * fVar306 * 0.5;
                fVar258 = (-fVar161 * fVar161 - fVar215 * 4.0) * 0.5;
                fVar215 = (fVar215 * 4.0 + fVar306 * fVar306) * 0.5;
                fVar203 = fVar161 * fVar161 * 0.5;
                fVar279 = fVar265 * local_468 +
                          fVar258 * local_478 + fVar215 * local_488 + fVar203 * local_458;
                fVar292 = fVar265 * fStack_464 +
                          fVar258 * fStack_474 + fVar215 * fStack_484 + fVar203 * fStack_454;
                fVar294 = fVar265 * fStack_460 +
                          fVar258 * fStack_470 + fVar215 * fStack_480 + fVar203 * fStack_450;
                fVar297 = fVar265 * fStack_45c +
                          fVar258 * fStack_46c + fVar215 * fStack_47c + fVar203 * fStack_44c;
                fVar203 = fVar161 - (fVar306 + fVar306);
                fVar215 = fVar306 - (fVar161 + fVar161);
                fVar308 = fVar306 * local_468 +
                          fVar203 * local_478 + fVar215 * local_488 + local_458 * fVar161;
                fVar310 = fVar306 * fStack_464 +
                          fVar203 * fStack_474 + fVar215 * fStack_484 + fStack_454 * fVar161;
                fVar306 = fVar306 * fStack_460 +
                          fVar203 * fStack_470 + fVar215 * fStack_480 + fStack_450 * fVar161;
                fVar258 = (fVar175 * fVar176 + 0.0) -
                          (fVar204 * local_468 +
                          fVar266 * local_478 + fVar177 * local_488 + fVar216 * local_458);
                fVar265 = (fVar175 * fVar84 + 0.0) -
                          (fVar204 * fStack_464 +
                          fVar266 * fStack_474 + fVar177 * fStack_484 + fVar216 * fStack_454);
                fVar266 = (fVar175 * fVar126 + 0.0) -
                          (fVar204 * fStack_460 +
                          fVar266 * fStack_470 + fVar177 * fStack_480 + fVar216 * fStack_450);
                fVar204 = (fVar175 * 0.0 + 0.0) - fVar214;
                fVar203 = fVar265 * fVar265;
                fVar215 = fVar266 * fVar266;
                fVar216 = fVar204 * fVar204;
                auVar274._0_4_ = fVar203 + fVar258 * fVar258 + fVar215;
                auVar274._4_4_ = fVar203 + fVar203 + fVar216;
                auVar274._8_4_ = fVar203 + fVar215 + fVar215;
                auVar274._12_4_ = fVar203 + fVar216 + fVar216;
                fVar203 = (float)local_4a8._0_4_;
                if ((float)local_4a8._0_4_ <= fVar205) {
                  fVar203 = fVar205;
                }
                fVar216 = fVar292 * fVar292 + fVar279 * fVar279 + fVar294 * fVar294;
                auVar86 = ZEXT416((uint)fVar216);
                auVar163 = rsqrtss(ZEXT416((uint)fVar216),auVar86);
                fVar205 = auVar163._0_4_;
                fVar177 = fVar205 * 1.5 - fVar205 * fVar205 * fVar216 * 0.5 * fVar205;
                fVar323 = fVar279 * fVar177;
                fVar325 = fVar292 * fVar177;
                fVar331 = fVar294 * fVar177;
                fVar332 = fVar297 * fVar177;
                fVar295 = fVar306 * fVar294 + fVar310 * fVar292 + fVar308 * fVar279;
                auVar86 = rcpss(auVar86,auVar86);
                fVar205 = (2.0 - fVar216 * auVar86._0_4_) * auVar86._0_4_;
                fVar215 = fVar265 * fVar325;
                fVar312 = fVar266 * fVar331;
                fVar319 = fVar204 * fVar332;
                fVar278 = fVar215 + fVar258 * fVar323 + fVar312;
                fVar293 = fVar215 + fVar215 + fVar319;
                fVar312 = fVar215 + fVar312 + fVar312;
                fVar319 = fVar215 + fVar319 + fVar319;
                fVar321 = (SQRT(auVar274._0_4_) + 1.0) * ((float)local_4a8._0_4_ / SQRT(fVar216)) +
                          SQRT(auVar274._0_4_) * (float)local_4a8._0_4_ + fVar203;
                fVar215 = fVar332 * 0.0;
                fVar332 = fVar332 * -fVar297;
                fVar310 = fVar331 * -fVar294 + fVar325 * -fVar292 + fVar323 * -fVar279 +
                          fVar205 * (fVar216 * fVar306 - fVar295 * fVar294) * fVar177 * fVar266 +
                          fVar205 * (fVar216 * fVar310 - fVar295 * fVar292) * fVar177 * fVar265 +
                          fVar205 * (fVar216 * fVar308 - fVar295 * fVar279) * fVar177 * fVar258;
                fVar205 = fVar126 * fVar331 + fVar84 * fVar325 + fVar176 * fVar323;
                fVar177 = auVar274._0_4_ - fVar278 * fVar278;
                auVar114._0_8_ = CONCAT44(auVar274._4_4_ - fVar293 * fVar293,fVar177);
                auVar114._8_4_ = auVar274._8_4_ - fVar312 * fVar312;
                auVar114._12_4_ = auVar274._12_4_ - fVar319 * fVar319;
                fVar308 = -fVar297 * fVar204;
                local_5c8 = CONCAT44(fVar332,fVar310);
                fVar204 = fVar204 * 0.0;
                fVar216 = (fVar126 * fVar266 + fVar84 * fVar265 + fVar176 * fVar258) -
                          fVar278 * fVar205;
                auVar148._8_4_ = auVar114._8_4_;
                auVar148._0_8_ = auVar114._0_8_;
                auVar148._12_4_ = auVar114._12_4_;
                auVar86 = rsqrtss(auVar148,auVar114);
                fVar306 = auVar86._0_4_;
                auVar194._0_4_ = fVar306 * 1.5 - fVar306 * fVar306 * fVar177 * 0.5 * fVar306;
                auVar194._4_12_ = auVar86._4_12_;
                if (fVar177 < 0.0) {
                  fStack_4c4 = (float)local_4a8._4_4_;
                  fStack_4c0 = fStack_4a0;
                  fStack_4bc = fStack_49c;
                  local_4d8._4_4_ = fVar293;
                  local_4d8._0_4_ = fVar278;
                  fStack_4d0 = fVar312;
                  fStack_4cc = fVar319;
                  _local_508 = auVar194;
                  local_4f8 = fVar216;
                  fStack_4f4 = fVar204;
                  fStack_4f0 = fVar126 * fVar266;
                  fStack_4ec = fVar204;
                  local_4e8 = fVar205;
                  fStack_4e4 = fVar215;
                  fStack_4e0 = fVar126 * fVar331;
                  fStack_4dc = fVar215;
                  local_4c8 = fVar203;
                  local_4b8 = auVar274;
                  fVar177 = sqrtf(fVar177);
                  auVar194 = _local_508;
                  auVar274 = local_4b8;
                  fVar203 = local_4c8;
                  fVar205 = local_4e8;
                  fVar215 = fStack_4e4;
                  fVar216 = local_4f8;
                  fVar204 = fStack_4f4;
                  fVar306 = (float)local_4d8._0_4_;
                }
                else {
                  fVar177 = SQRT(fVar177);
                  fVar306 = fVar278;
                }
                fVar177 = fVar177 - fVar214;
                fVar214 = ((-fVar294 * fVar266 + -fVar292 * fVar265 + -fVar279 * fVar258) -
                          fVar278 * fVar310) * auVar194._0_4_ - fVar297;
                fVar216 = fVar216 * auVar194._0_4_;
                auVar195._0_4_ = fVar310 * fVar216 - fVar205 * fVar214;
                auVar211._8_4_ = -fVar308;
                auVar211._0_8_ = CONCAT44(fVar308,fVar214) ^ 0x8000000000000000;
                auVar211._12_4_ = fVar204;
                auVar210._8_8_ = auVar211._8_8_;
                auVar210._0_8_ = CONCAT44(fVar216,fVar214) ^ 0x80000000;
                auVar195._4_4_ = auVar195._0_4_;
                auVar195._8_4_ = auVar195._0_4_;
                auVar195._12_4_ = auVar195._0_4_;
                auVar86 = divps(auVar210,auVar195);
                auVar245._8_4_ = fVar332;
                auVar245._0_8_ = local_5c8;
                auVar245._12_4_ = -fVar215;
                auVar244._8_8_ = auVar245._8_8_;
                auVar244._0_8_ = CONCAT44(fVar205,fVar310) ^ 0x8000000000000000;
                auVar163 = divps(auVar244,auVar195);
                fVar175 = fVar175 - (fVar177 * auVar163._0_4_ + fVar306 * auVar86._0_4_);
                fVar161 = fVar161 - (fVar177 * auVar163._4_4_ + fVar306 * auVar86._4_4_);
                if ((ABS(fVar306) < fVar321) &&
                   (ABS(fVar177) < auVar260._12_4_ * 1.9073486e-06 + fVar203 + fVar321)) {
                  fVar175 = (float)local_418._0_4_ + fVar175;
                  if ((fVar125 <= fVar175) &&
                     (fVar203 = *(float *)(ray + k * 4 + 0x80), fVar175 <= fVar203)) {
                    uVar66 = 0;
                    if ((fVar161 < 0.0) || (1.0 < fVar161)) goto LAB_00b01b53;
                    auVar86 = rsqrtss(auVar274,auVar274);
                    fVar204 = auVar86._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_490].ptr;
                    pRVar71 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar66 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar204 = fVar204 * 1.5 +
                                  fVar204 * fVar204 * auVar274._0_4_ * -0.5 * fVar204;
                        fVar258 = fVar258 * fVar204;
                        fVar265 = fVar265 * fVar204;
                        fVar266 = fVar266 * fVar204;
                        fVar204 = fVar297 * fVar258 + fVar279;
                        fVar205 = fVar297 * fVar265 + fVar292;
                        fVar214 = fVar297 * fVar266 + fVar294;
                        fVar215 = fVar265 * fVar279 - fVar292 * fVar258;
                        fVar216 = fVar266 * fVar292 - fVar294 * fVar265;
                        fVar258 = fVar258 * fVar294 - fVar279 * fVar266;
                        local_2b8 = fVar216 * fVar205 - fVar258 * fVar204;
                        local_2d8._4_4_ = fVar258 * fVar214 - fVar215 * fVar205;
                        local_2c8 = fVar215 * fVar204 - fVar216 * fVar214;
                        local_2d8._0_4_ = local_2d8._4_4_;
                        fStack_2d0 = (float)local_2d8._4_4_;
                        fStack_2cc = (float)local_2d8._4_4_;
                        fStack_2c4 = local_2c8;
                        fStack_2c0 = local_2c8;
                        fStack_2bc = local_2c8;
                        fStack_2b4 = local_2b8;
                        fStack_2b0 = local_2b8;
                        fStack_2ac = local_2b8;
                        local_2a8 = fVar161;
                        fStack_2a4 = fVar161;
                        fStack_2a0 = fVar161;
                        fStack_29c = fVar161;
                        local_298 = 0;
                        uStack_294 = 0;
                        uStack_290 = 0;
                        uStack_28c = 0;
                        local_288 = CONCAT44(uStack_3d4,local_3d8);
                        uStack_280 = CONCAT44(uStack_3cc,uStack_3d0);
                        local_278 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_270 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar175;
                        local_588 = *local_498;
                        _local_568 = (int *)local_588;
                        uStack_560 = pGVar19->userPtr;
                        local_558 = context->user;
                        local_550 = ray;
                        local_548 = (RTCHitN *)local_2d8;
                        local_540 = 4;
                        p_Var68 = pGVar19->occlusionFilterN;
                        if (p_Var68 != (RTCFilterFunctionN)0x0) {
                          p_Var68 = (RTCFilterFunctionN)
                                    (*p_Var68)((RTCFilterFunctionNArguments *)local_568);
                        }
                        auVar149._0_4_ = -(uint)(local_588._0_4_ == 0);
                        auVar149._4_4_ = -(uint)(local_588._4_4_ == 0);
                        auVar149._8_4_ = -(uint)(local_588._8_4_ == 0);
                        auVar149._12_4_ = -(uint)(local_588._12_4_ == 0);
                        uVar79 = movmskps((int)p_Var68,auVar149);
                        pRVar67 = (RayK<4> *)(ulong)(uVar79 ^ 0xf);
                        if ((uVar79 ^ 0xf) == 0) {
                          auVar149 = auVar149 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar71->filter)(local_568);
                          }
                          auVar115._0_4_ = -(uint)(local_588._0_4_ == 0);
                          auVar115._4_4_ = -(uint)(local_588._4_4_ == 0);
                          auVar115._8_4_ = -(uint)(local_588._8_4_ == 0);
                          auVar115._12_4_ = -(uint)(local_588._12_4_ == 0);
                          auVar149 = auVar115 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_550 + 0x80) =
                               ~auVar115 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_550 + 0x80) & auVar115;
                          pRVar67 = local_550;
                        }
                        auVar150._0_4_ = auVar149._0_4_ << 0x1f;
                        auVar150._4_4_ = auVar149._4_4_ << 0x1f;
                        auVar150._8_4_ = auVar149._8_4_ << 0x1f;
                        auVar150._12_4_ = auVar149._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar67,auVar150);
                        uVar66 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar67 >> 0x20),iVar62) >> 8
                                                ),iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar203;
                        }
                      }
                      goto LAB_00b01b53;
                    }
                  }
                  uVar66 = 0;
                  goto LAB_00b01b53;
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              uVar66 = 5;
LAB_00b01b53:
              fVar265 = *(float *)(ray + k * 4 + 0x80);
              local_3f8._0_4_ = -(uint)(local_518 <= fVar265) & local_3f8._0_4_;
              local_3f8._4_4_ = -(uint)(fStack_514 <= fVar265) & local_3f8._4_4_;
              local_3f8._8_4_ = -(uint)(fStack_510 <= fVar265) & local_3f8._8_4_;
              local_3f8._12_4_ = -(uint)(fStack_50c <= fVar265) & local_3f8._12_4_;
              bVar74 = (bool)(bVar74 | bVar78 & (byte)uVar66);
              uVar70 = (undefined4)((ulong)uVar66 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_3f8);
            } while (iVar62 != 0);
            fVar205 = (float)local_248._0_4_;
            fVar214 = (float)local_248._4_4_;
            fVar215 = fStack_240;
            fVar216 = fStack_23c;
          }
          uVar63 = SUB84(pRVar71,0);
          auVar151._0_4_ = -(uint)(fVar247 + fVar178 <= fVar265) & local_428._0_4_;
          auVar151._4_4_ = -(uint)(fVar248 + fVar178 <= fVar265) & local_428._4_4_;
          auVar151._8_4_ = -(uint)(fVar256 + fVar178 <= fVar265) & (uint)fStack_420;
          auVar151._12_4_ = -(uint)(fVar257 + fVar178 <= fVar265) & (uint)fStack_41c;
          auVar116._0_4_ =
               -(uint)((int)local_448 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5e8._0_4_ * fVar85 +
                                                 fVar160 * fVar84 + fVar237)) & local_538._0_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar116._4_4_ =
               -(uint)((int)fStack_444 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5e8._4_4_ * fVar85 +
                                                 fVar267 * fVar84 + fVar238)) & local_538._4_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar116._8_4_ =
               -(uint)((int)fStack_440 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5e0 * fVar85 + fVar276 * fVar84 + fVar239))
                             & (uint)fStack_530) << 0x1f) >> 0x1f) + 4);
          auVar116._12_4_ =
               -(uint)((int)fStack_43c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5dc * fVar85 + fVar277 * fVar84 + fVar246))
                             & (uint)fStack_52c) << 0x1f) >> 0x1f) + 4);
          local_408 = ~auVar116 & auVar151;
          iVar62 = movmskps(0,local_408);
          if (iVar62 != 0) {
            local_518 = fVar178 + fVar205;
            fStack_514 = fVar178 + fVar214;
            fStack_510 = fVar178 + fVar215;
            fStack_50c = fVar178 + fVar216;
            do {
              uVar79 = local_408._0_4_;
              uVar80 = local_408._4_4_;
              uVar81 = local_408._8_4_;
              uVar82 = local_408._12_4_;
              auVar152._0_4_ = uVar79 & (uint)fVar205;
              auVar152._4_4_ = uVar80 & (uint)fVar214;
              auVar152._8_4_ = uVar81 & (uint)fVar215;
              auVar152._12_4_ = uVar82 & (uint)fVar216;
              auVar171._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
              auVar171._8_4_ = ~uVar81 & 0x7f800000;
              auVar171._12_4_ = ~uVar82 & 0x7f800000;
              auVar171 = auVar171 | auVar152;
              auVar196._4_4_ = auVar171._0_4_;
              auVar196._0_4_ = auVar171._4_4_;
              auVar196._8_4_ = auVar171._12_4_;
              auVar196._12_4_ = auVar171._8_4_;
              auVar86 = minps(auVar196,auVar171);
              auVar153._0_8_ = auVar86._8_8_;
              auVar153._8_4_ = auVar86._0_4_;
              auVar153._12_4_ = auVar86._4_4_;
              auVar86 = minps(auVar153,auVar86);
              auVar154._0_8_ =
                   CONCAT44(-(uint)(auVar86._4_4_ == auVar171._4_4_) & uVar80,
                            -(uint)(auVar86._0_4_ == auVar171._0_4_) & uVar79);
              auVar154._8_4_ = -(uint)(auVar86._8_4_ == auVar171._8_4_) & uVar81;
              auVar154._12_4_ = -(uint)(auVar86._12_4_ == auVar171._12_4_) & uVar82;
              iVar62 = movmskps(iVar62,auVar154);
              auVar117 = local_408;
              if (iVar62 != 0) {
                auVar117._8_4_ = auVar154._8_4_;
                auVar117._0_8_ = auVar154._0_8_;
                auVar117._12_4_ = auVar154._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar117);
              lVar22 = 0;
              if (CONCAT44(uVar70,uVar63) != 0) {
                for (; (CONCAT44(uVar70,uVar63) >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              *(undefined4 *)(local_408 + lVar22 * 4) = 0;
              auVar33._4_4_ = fStack_464;
              auVar33._0_4_ = local_468;
              auVar33._8_4_ = fStack_460;
              auVar33._12_4_ = fStack_45c;
              auVar31._4_4_ = fStack_474;
              auVar31._0_4_ = local_478;
              auVar31._8_4_ = fStack_470;
              auVar31._12_4_ = fStack_46c;
              auVar163 = minps(auVar33,auVar31);
              auVar272 = maxps(auVar33,auVar31);
              auVar29._4_4_ = fStack_484;
              auVar29._0_4_ = local_488;
              auVar29._8_4_ = fStack_480;
              auVar29._12_4_ = fStack_47c;
              auVar35._4_4_ = fStack_454;
              auVar35._0_4_ = local_458;
              auVar35._8_4_ = fStack_450;
              auVar35._12_4_ = fStack_44c;
              auVar86 = minps(auVar29,auVar35);
              auVar163 = minps(auVar163,auVar86);
              auVar86 = maxps(auVar29,auVar35);
              auVar272 = maxps(auVar272,auVar86);
              auVar197._0_8_ = auVar163._0_8_ & 0x7fffffff7fffffff;
              auVar197._8_4_ = auVar163._8_4_ & 0x7fffffff;
              auVar197._12_4_ = auVar163._12_4_ & 0x7fffffff;
              auVar118._0_8_ = auVar272._0_8_ & 0x7fffffff7fffffff;
              auVar118._8_4_ = auVar272._8_4_ & 0x7fffffff;
              auVar118._12_4_ = ABS(auVar272._12_4_);
              auVar86 = maxps(auVar197,auVar118);
              fVar161 = auVar86._4_4_;
              if (auVar86._4_4_ <= auVar86._0_4_) {
                fVar161 = auVar86._0_4_;
              }
              auVar198._8_8_ = auVar86._8_8_;
              auVar198._0_8_ = auVar86._8_8_;
              if (auVar86._8_4_ <= fVar161) {
                auVar198._0_4_ = fVar161;
              }
              fVar203 = auVar198._0_4_ * 1.9073486e-06;
              fVar161 = local_118[lVar22];
              fVar175 = *(float *)(local_238 + lVar22 * 4);
              bVar78 = true;
              uVar75 = 0;
              do {
                fVar238 = SQRT(fVar128) * 1.9073486e-06 * fVar175;
                fVar276 = 1.0 - fVar161;
                fVar204 = fVar276 * fVar276 * fVar276;
                fVar247 = fVar161 * fVar161 * fVar161;
                fVar246 = fVar161 * fVar276;
                fVar237 = fVar204 * 0.16666667;
                fVar257 = (fVar276 * fVar246 * 12.0 + fVar161 * fVar246 * 6.0 +
                          fVar204 * 4.0 + fVar247) * 0.16666667;
                fVar258 = (fVar161 * fVar246 * 12.0 + fVar276 * fVar246 * 6.0 +
                          fVar247 * 4.0 + fVar204) * 0.16666667;
                fVar247 = fVar247 * 0.16666667;
                fVar239 = fVar237 * fStack_45c +
                          fVar257 * fStack_46c + fVar258 * fStack_47c + fVar247 * fStack_44c;
                fVar256 = -fVar276 * fVar276 * 0.5;
                fVar248 = (-fVar161 * fVar161 - fVar246 * 4.0) * 0.5;
                fVar246 = (fVar246 * 4.0 + fVar276 * fVar276) * 0.5;
                fVar204 = fVar161 * fVar161 * 0.5;
                fVar265 = fVar256 * local_468 +
                          fVar248 * local_478 + fVar246 * local_488 + fVar204 * local_458;
                fVar266 = fVar256 * fStack_464 +
                          fVar248 * fStack_474 + fVar246 * fStack_484 + fVar204 * fStack_454;
                fVar160 = fVar256 * fStack_460 +
                          fVar248 * fStack_470 + fVar246 * fStack_480 + fVar204 * fStack_450;
                fVar267 = fVar256 * fStack_45c +
                          fVar248 * fStack_46c + fVar246 * fStack_47c + fVar204 * fStack_44c;
                fVar204 = fVar161 - (fVar276 + fVar276);
                fVar246 = fVar276 - (fVar161 + fVar161);
                fVar277 = fVar276 * local_468 +
                          fVar204 * local_478 + fVar246 * local_488 + local_458 * fVar161;
                fVar177 = fVar276 * fStack_464 +
                          fVar204 * fStack_474 + fVar246 * fStack_484 + fStack_454 * fVar161;
                fVar276 = fVar276 * fStack_460 +
                          fVar204 * fStack_470 + fVar246 * fStack_480 + fStack_450 * fVar161;
                fVar248 = (fVar175 * fVar176 + 0.0) -
                          (fVar237 * local_468 +
                          fVar257 * local_478 + fVar258 * local_488 + fVar247 * local_458);
                fVar256 = (fVar175 * fVar84 + 0.0) -
                          (fVar237 * fStack_464 +
                          fVar257 * fStack_474 + fVar258 * fStack_484 + fVar247 * fStack_454);
                fVar257 = (fVar175 * fVar126 + 0.0) -
                          (fVar237 * fStack_460 +
                          fVar257 * fStack_470 + fVar258 * fStack_480 + fVar247 * fStack_450);
                fVar237 = (fVar175 * 0.0 + 0.0) - fVar239;
                fVar204 = fVar256 * fVar256;
                fVar246 = fVar257 * fVar257;
                fVar247 = fVar237 * fVar237;
                auVar275._0_4_ = fVar204 + fVar248 * fVar248 + fVar246;
                auVar275._4_4_ = fVar204 + fVar204 + fVar247;
                auVar275._8_4_ = fVar204 + fVar246 + fVar246;
                auVar275._12_4_ = fVar204 + fVar247 + fVar247;
                local_5c8._4_4_ = auVar198._4_4_;
                uStack_5c0 = auVar198._8_4_;
                uStack_5bc = auVar198._12_4_;
                fVar204 = fVar203;
                if (fVar203 <= fVar238) {
                  fVar204 = fVar238;
                }
                fVar247 = fVar266 * fVar266 + fVar265 * fVar265 + fVar160 * fVar160;
                auVar86 = ZEXT416((uint)fVar247);
                auVar163 = rsqrtss(ZEXT416((uint)fVar247),auVar86);
                fVar238 = auVar163._0_4_;
                fVar258 = fVar238 * 1.5 - fVar238 * fVar238 * fVar247 * 0.5 * fVar238;
                fVar297 = fVar265 * fVar258;
                fVar308 = fVar266 * fVar258;
                fVar310 = fVar160 * fVar258;
                local_5b8._4_4_ = fVar267 * fVar258;
                fVar319 = fVar276 * fVar160 + fVar177 * fVar266 + fVar277 * fVar265;
                auVar86 = rcpss(auVar86,auVar86);
                fVar238 = (2.0 - fVar247 * auVar86._0_4_) * auVar86._0_4_;
                fVar246 = fVar256 * fVar308;
                fVar292 = fVar257 * fVar310;
                fVar294 = fVar237 * (float)local_5b8._4_4_;
                fVar279 = fVar246 + fVar248 * fVar297 + fVar292;
                fVar312 = fVar246 + fVar246 + fVar294;
                fVar292 = fVar246 + fVar292 + fVar292;
                fVar294 = fVar246 + fVar294 + fVar294;
                fVar306 = (SQRT(auVar275._0_4_) + 1.0) * (fVar203 / SQRT(fVar247)) +
                          SQRT(auVar275._0_4_) * fVar203 + fVar204;
                fVar246 = (float)local_5b8._4_4_ * 0.0;
                local_5b8._4_4_ = (float)local_5b8._4_4_ * -fVar267;
                local_5b8._0_4_ =
                     fVar310 * -fVar160 + fVar308 * -fVar266 + fVar297 * -fVar265 +
                     fVar238 * (fVar247 * fVar276 - fVar319 * fVar160) * fVar258 * fVar257 +
                     fVar238 * (fVar247 * fVar177 - fVar319 * fVar266) * fVar258 * fVar256 +
                     fVar238 * (fVar247 * fVar277 - fVar319 * fVar265) * fVar258 * fVar248;
                fVar238 = fVar126 * fVar310 + fVar84 * fVar308 + fVar176 * fVar297;
                fVar277 = auVar275._0_4_ - fVar279 * fVar279;
                auVar119._0_8_ = CONCAT44(auVar275._4_4_ - fVar312 * fVar312,fVar277);
                auVar119._8_4_ = auVar275._8_4_ - fVar292 * fVar292;
                auVar119._12_4_ = auVar275._12_4_ - fVar294 * fVar294;
                fVar297 = -fVar160 * fVar257;
                fVar276 = -fVar267 * fVar237;
                fVar258 = (fVar297 + -fVar266 * fVar256 + -fVar265 * fVar248) -
                          fVar279 * (float)local_5b8._0_4_;
                fVar237 = fVar237 * 0.0;
                fVar247 = (fVar126 * fVar257 + fVar84 * fVar256 + fVar176 * fVar248) -
                          fVar279 * fVar238;
                auVar155._8_4_ = auVar119._8_4_;
                auVar155._0_8_ = auVar119._0_8_;
                auVar155._12_4_ = auVar119._12_4_;
                auVar86 = rsqrtss(auVar155,auVar119);
                fVar177 = auVar86._0_4_;
                auVar199._0_4_ = fVar177 * 1.5 - fVar177 * fVar177 * fVar277 * 0.5 * fVar177;
                auVar199._4_12_ = auVar86._4_12_;
                if (fVar277 < 0.0) {
                  local_4b8._4_4_ = local_5c8._4_4_;
                  local_4b8._0_4_ = fVar204;
                  local_4b8._8_4_ = uStack_5c0;
                  local_4b8._12_4_ = uStack_5bc;
                  local_4d8._4_4_ = fVar312;
                  local_4d8._0_4_ = fVar279;
                  fStack_4d0 = fVar292;
                  fStack_4cc = fVar294;
                  _local_508 = auVar199;
                  local_4f8 = fVar247;
                  fStack_4f4 = fVar237;
                  fStack_4f0 = fVar126 * fVar257;
                  fStack_4ec = fVar237;
                  local_4e8 = fVar238;
                  fStack_4e4 = fVar246;
                  fStack_4e0 = fVar126 * fVar310;
                  fStack_4dc = fVar246;
                  local_4c8 = fVar258;
                  fStack_4c4 = fVar276;
                  fStack_4c0 = fVar297;
                  fStack_4bc = fVar276;
                  _local_4a8 = auVar275;
                  fVar277 = sqrtf(fVar277);
                  auVar199 = _local_508;
                  auVar275 = _local_4a8;
                  fVar204 = (float)local_4b8._0_4_;
                  fVar238 = local_4e8;
                  fVar246 = fStack_4e4;
                  fVar247 = local_4f8;
                  fVar237 = fStack_4f4;
                  fVar258 = local_4c8;
                  fVar276 = fStack_4c4;
                  fVar279 = (float)local_4d8._0_4_;
                }
                else {
                  fVar277 = SQRT(fVar277);
                }
                fVar277 = fVar277 - fVar239;
                fVar239 = fVar258 * auVar199._0_4_ - fVar267;
                fVar247 = fVar247 * auVar199._0_4_;
                auVar289._0_8_ = CONCAT44(fVar276,fVar239) ^ 0x8000000080000000;
                auVar200._0_4_ = (float)local_5b8._0_4_ * fVar247 - fVar238 * fVar239;
                auVar289._8_4_ = -fVar276;
                auVar289._12_4_ = fVar237;
                auVar288._8_8_ = auVar289._8_8_;
                auVar288._0_8_ = CONCAT44(fVar247,fVar239) ^ 0x80000000;
                auVar200._4_4_ = auVar200._0_4_;
                auVar200._8_4_ = auVar200._0_4_;
                auVar200._12_4_ = auVar200._0_4_;
                auVar163 = divps(auVar288,auVar200);
                auVar213._8_4_ = local_5b8._4_4_;
                auVar213._0_8_ = local_5b8;
                auVar213._12_4_ = -fVar246;
                auVar212._8_8_ = auVar213._8_8_;
                auVar212._0_8_ = CONCAT44(fVar238,local_5b8._0_4_) ^ 0x8000000000000000;
                auVar86 = divps(auVar212,auVar200);
                fVar175 = fVar175 - (fVar277 * auVar86._0_4_ + fVar279 * auVar163._0_4_);
                fVar161 = fVar161 - (fVar277 * auVar86._4_4_ + fVar279 * auVar163._4_4_);
                if ((ABS(fVar279) < fVar306) &&
                   (ABS(fVar277) < auVar272._12_4_ * 1.9073486e-06 + fVar204 + fVar306)) {
                  fVar175 = (float)local_418._0_4_ + fVar175;
                  if (fVar175 < fVar125) {
                    uVar66 = 0;
                    goto LAB_00b025d1;
                  }
                  fVar203 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar175 <= fVar203) {
                    uVar66 = 0;
                    if ((fVar161 < 0.0) || (1.0 < fVar161)) goto LAB_00b025d1;
                    auVar86 = rsqrtss(auVar275,auVar275);
                    fVar204 = auVar86._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_490].ptr;
                    pRVar71 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar66 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar204 = fVar204 * 1.5 +
                                  fVar204 * fVar204 * auVar275._0_4_ * -0.5 * fVar204;
                        fVar248 = fVar248 * fVar204;
                        fVar256 = fVar256 * fVar204;
                        fVar257 = fVar257 * fVar204;
                        fVar204 = fVar267 * fVar248 + fVar265;
                        fVar237 = fVar267 * fVar256 + fVar266;
                        fVar238 = fVar267 * fVar257 + fVar160;
                        fVar239 = fVar256 * fVar265 - fVar266 * fVar248;
                        fVar246 = fVar257 * fVar266 - fVar160 * fVar256;
                        fVar247 = fVar248 * fVar160 - fVar265 * fVar257;
                        local_2b8 = fVar246 * fVar237 - fVar247 * fVar204;
                        local_2d8._4_4_ = fVar247 * fVar238 - fVar239 * fVar237;
                        local_2c8 = fVar239 * fVar204 - fVar246 * fVar238;
                        local_2d8._0_4_ = local_2d8._4_4_;
                        fStack_2d0 = (float)local_2d8._4_4_;
                        fStack_2cc = (float)local_2d8._4_4_;
                        fStack_2c4 = local_2c8;
                        fStack_2c0 = local_2c8;
                        fStack_2bc = local_2c8;
                        fStack_2b4 = local_2b8;
                        fStack_2b0 = local_2b8;
                        fStack_2ac = local_2b8;
                        local_2a8 = fVar161;
                        fStack_2a4 = fVar161;
                        fStack_2a0 = fVar161;
                        fStack_29c = fVar161;
                        local_298 = 0;
                        uStack_294 = 0;
                        uStack_290 = 0;
                        uStack_28c = 0;
                        local_288 = CONCAT44(uStack_3d4,local_3d8);
                        uStack_280 = CONCAT44(uStack_3cc,uStack_3d0);
                        local_278 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_270 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar175;
                        local_588 = *local_498;
                        _local_568 = (int *)local_588;
                        uStack_560 = pGVar19->userPtr;
                        local_558 = context->user;
                        local_550 = ray;
                        local_548 = (RTCHitN *)local_2d8;
                        local_540 = 4;
                        p_Var68 = pGVar19->occlusionFilterN;
                        if (p_Var68 != (RTCFilterFunctionN)0x0) {
                          p_Var68 = (RTCFilterFunctionN)
                                    (*p_Var68)((RTCFilterFunctionNArguments *)local_568);
                        }
                        auVar156._0_4_ = -(uint)(local_588._0_4_ == 0);
                        auVar156._4_4_ = -(uint)(local_588._4_4_ == 0);
                        auVar156._8_4_ = -(uint)(local_588._8_4_ == 0);
                        auVar156._12_4_ = -(uint)(local_588._12_4_ == 0);
                        uVar79 = movmskps((int)p_Var68,auVar156);
                        pRVar67 = (RayK<4> *)(ulong)(uVar79 ^ 0xf);
                        if ((uVar79 ^ 0xf) == 0) {
                          auVar156 = auVar156 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar71->filter)(local_568);
                          }
                          auVar120._0_4_ = -(uint)(local_588._0_4_ == 0);
                          auVar120._4_4_ = -(uint)(local_588._4_4_ == 0);
                          auVar120._8_4_ = -(uint)(local_588._8_4_ == 0);
                          auVar120._12_4_ = -(uint)(local_588._12_4_ == 0);
                          auVar156 = auVar120 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_550 + 0x80) =
                               ~auVar120 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_550 + 0x80) & auVar120;
                          pRVar67 = local_550;
                        }
                        auVar157._0_4_ = auVar156._0_4_ << 0x1f;
                        auVar157._4_4_ = auVar156._4_4_ << 0x1f;
                        auVar157._8_4_ = auVar156._8_4_ << 0x1f;
                        auVar157._12_4_ = auVar156._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar67,auVar157);
                        uVar66 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar67 >> 0x20),iVar62) >> 8
                                                ),iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar203;
                        }
                      }
                      goto LAB_00b025d1;
                    }
                  }
                  uVar66 = 0;
                  goto LAB_00b025d1;
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              uVar66 = 5;
LAB_00b025d1:
              uVar63 = SUB84(pRVar71,0);
              fVar265 = *(float *)(ray + k * 4 + 0x80);
              local_408._0_4_ = -(uint)(local_518 <= fVar265) & local_408._0_4_;
              local_408._4_4_ = -(uint)(fStack_514 <= fVar265) & local_408._4_4_;
              local_408._8_4_ = -(uint)(fStack_510 <= fVar265) & local_408._8_4_;
              local_408._12_4_ = -(uint)(fStack_50c <= fVar265) & local_408._12_4_;
              bVar74 = (bool)(bVar74 | bVar78 & (byte)uVar66);
              uVar70 = (undefined4)((ulong)uVar66 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_408);
            } while (iVar62 != 0);
            iVar62 = 0;
            fVar205 = (float)local_248._0_4_;
            fVar214 = (float)local_248._4_4_;
            fVar215 = fStack_240;
            fVar216 = fStack_23c;
          }
          auVar201._0_4_ =
               local_578._0_4_ & local_438._0_4_ &
               -(uint)(fVar178 + (float)local_138._0_4_ <= fVar265);
          auVar201._4_4_ =
               local_578._4_4_ & local_438._4_4_ &
               -(uint)(fVar178 + (float)local_138._4_4_ <= fVar265);
          auVar201._8_4_ =
               (uint)fStack_570 & (uint)fStack_430 & -(uint)(fVar178 + fStack_130 <= fVar265);
          auVar201._12_4_ =
               (uint)fStack_56c & (uint)fStack_42c & -(uint)(fVar178 + fStack_12c <= fVar265);
          auVar172._0_4_ = auVar116._0_4_ & auVar151._0_4_ & -(uint)(fVar178 + fVar205 <= fVar265);
          auVar172._4_4_ = auVar116._4_4_ & auVar151._4_4_ & -(uint)(fVar178 + fVar214 <= fVar265);
          auVar172._8_4_ = auVar116._8_4_ & auVar151._8_4_ & -(uint)(fVar178 + fVar215 <= fVar265);
          auVar172._12_4_ =
               auVar116._12_4_ & auVar151._12_4_ & -(uint)(fVar178 + fVar216 <= fVar265);
          iVar62 = movmskps(iVar62,auVar172 | auVar201);
          if (iVar62 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar77 * 0x30) = auVar172 | auVar201;
            auStack_e8[uVar77 * 0xc] =
                 ~auVar201._0_4_ & (uint)fVar205 | local_138._0_4_ & auVar201._0_4_;
            auStack_e8[uVar77 * 0xc + 1] =
                 ~auVar201._4_4_ & (uint)fVar214 | local_138._4_4_ & auVar201._4_4_;
            auStack_e8[uVar77 * 0xc + 2] =
                 ~auVar201._8_4_ & (uint)fVar215 | (uint)fStack_130 & auVar201._8_4_;
            auStack_e8[uVar77 * 0xc + 3] =
                 ~auVar201._12_4_ & (uint)fVar216 | (uint)fStack_12c & auVar201._12_4_;
            (&uStack_d8)[uVar77 * 6] = CONCAT44(fStack_1d4,local_1d8);
            aiStack_d0[uVar77 * 0xc] = (int)fVar127 + 1;
            iVar76 = iVar76 + 1;
          }
        }
      }
    }
    if (iVar76 == 0) break;
    fVar127 = *(float *)(ray + k * 4 + 0x80);
    uVar80 = -iVar76;
    pauVar69 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar76 - 1) * 0x30);
    uVar79 = uVar80;
    while( true ) {
      auVar158._0_4_ = -(uint)(fVar178 + *(float *)pauVar69[1] <= fVar127) & *(uint *)*pauVar69;
      auVar158._4_4_ =
           -(uint)(fVar178 + *(float *)(pauVar69[1] + 4) <= fVar127) & *(uint *)(*pauVar69 + 4);
      auVar158._8_4_ =
           -(uint)(fVar178 + *(float *)(pauVar69[1] + 8) <= fVar127) & *(uint *)(*pauVar69 + 8);
      auVar158._12_4_ =
           -(uint)(fVar178 + *(float *)(pauVar69[1] + 0xc) <= fVar127) & *(uint *)(*pauVar69 + 0xc);
      _local_2d8 = auVar158;
      iVar62 = movmskps(uVar79,auVar158);
      if (iVar62 != 0) break;
      pauVar69 = pauVar69 + -3;
      uVar80 = uVar80 + 1;
      uVar79 = 0;
      if (uVar80 == 0) {
        uVar63 = 0;
        goto LAB_00b02b31;
      }
    }
    auVar173._0_4_ = (uint)*(float *)pauVar69[1] & auVar158._0_4_;
    auVar173._4_4_ = (uint)*(float *)(pauVar69[1] + 4) & auVar158._4_4_;
    auVar173._8_4_ = (uint)*(float *)(pauVar69[1] + 8) & auVar158._8_4_;
    auVar173._12_4_ = (uint)*(float *)(pauVar69[1] + 0xc) & auVar158._12_4_;
    auVar202._0_8_ = CONCAT44(~auVar158._4_4_,~auVar158._0_4_) & 0x7f8000007f800000;
    auVar202._8_4_ = ~auVar158._8_4_ & 0x7f800000;
    auVar202._12_4_ = ~auVar158._12_4_ & 0x7f800000;
    auVar202 = auVar202 | auVar173;
    auVar174._4_4_ = auVar202._0_4_;
    auVar174._0_4_ = auVar202._4_4_;
    auVar174._8_4_ = auVar202._12_4_;
    auVar174._12_4_ = auVar202._8_4_;
    auVar86 = minps(auVar174,auVar202);
    auVar121._0_8_ = auVar86._8_8_;
    auVar121._8_4_ = auVar86._0_4_;
    auVar121._12_4_ = auVar86._4_4_;
    auVar86 = minps(auVar121,auVar86);
    auVar122._0_8_ =
         CONCAT44(-(uint)(auVar86._4_4_ == auVar202._4_4_) & auVar158._4_4_,
                  -(uint)(auVar86._0_4_ == auVar202._0_4_) & auVar158._0_4_);
    auVar122._8_4_ = -(uint)(auVar86._8_4_ == auVar202._8_4_) & auVar158._8_4_;
    auVar122._12_4_ = -(uint)(auVar86._12_4_ == auVar202._12_4_) & auVar158._12_4_;
    iVar62 = movmskps(iVar62,auVar122);
    if (iVar62 != 0) {
      auVar158._8_4_ = auVar122._8_4_;
      auVar158._0_8_ = auVar122._0_8_;
      auVar158._12_4_ = auVar122._12_4_;
    }
    uVar66 = *(undefined8 *)pauVar69[2];
    fVar127 = *(float *)(pauVar69[2] + 8);
    uVar79 = movmskps(iVar62,auVar158);
    pRVar71 = (RTCIntersectArguments *)0x0;
    if (uVar79 != 0) {
      for (; (uVar79 >> (long)pRVar71 & 1) == 0;
          pRVar71 = (RTCIntersectArguments *)((long)&pRVar71->flags + 1)) {
      }
    }
    *(undefined4 *)(local_2d8 + (long)pRVar71 * 4) = 0;
    *pauVar69 = _local_2d8;
    iVar62 = movmskps((int)pauVar69,_local_2d8);
    lVar65 = CONCAT44((int)((ulong)pauVar69 >> 0x20),iVar62);
    uVar79 = ~uVar80;
    if (iVar62 != 0) {
      uVar79 = -uVar80;
    }
    uVar77 = (ulong)uVar79;
    fVar161 = (float)uVar66;
    fVar175 = (float)((ulong)uVar66 >> 0x20) - fVar161;
    _local_568 = (int *)CONCAT44(fVar175 * 0.33333334 + fVar161,fVar175 * 0.0 + fVar161);
    uStack_560 = (void *)CONCAT44(fVar175 * 1.0 + fVar161,fVar175 * 0.6666667 + fVar161);
    local_1d8 = *(float *)(local_568 + (long)pRVar71 * 4);
    fStack_1d4 = *(float *)(local_568 + (long)pRVar71 * 4 + 4);
  } while( true );
LAB_00b02b31:
  if (bVar74 != false) {
    return bVar74;
  }
  fVar176 = *(float *)(ray + k * 4 + 0x80);
  auVar159._4_4_ = -(uint)(fStack_224 <= fVar176);
  auVar159._0_4_ = -(uint)(local_228 <= fVar176);
  auVar159._8_4_ = -(uint)(fStack_220 <= fVar176);
  auVar159._12_4_ = -(uint)(fStack_21c <= fVar176);
  uVar79 = movmskps(uVar63,auVar159);
  uVar79 = (uint)local_3e0 - 1 & (uint)local_3e0 & uVar79;
  if (uVar79 == 0) {
    return false;
  }
  goto LAB_00b00183;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }